

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined6 uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  int iVar61;
  undefined4 uVar62;
  ulong uVar63;
  ulong uVar64;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *extraout_RAX_01;
  RayHit *extraout_RAX_02;
  RayHit *pRVar65;
  undefined4 uVar67;
  RayHit *extraout_RAX_03;
  RayHit *extraout_RAX_04;
  RayHit *extraout_RAX_05;
  RayHit *extraout_RAX_06;
  RayHit *pRVar66;
  RTCIntersectArguments *pRVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  long lVar72;
  long lVar73;
  bool bVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  short sVar79;
  undefined2 uVar118;
  float fVar80;
  uint uVar81;
  float fVar119;
  float fVar121;
  __m128 a_1;
  uint uVar120;
  uint uVar122;
  uint uVar123;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar124;
  float fVar147;
  float fVar148;
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar163;
  float fVar164;
  vfloat4 v;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar165;
  float fVar184;
  float fVar185;
  vfloat4 v_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar186;
  float fVar202;
  float fVar203;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar224;
  float fVar225;
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar232;
  float fVar233;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar234;
  float fVar250;
  float fVar251;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  undefined1 auVar249 [16];
  float fVar252;
  float fVar257;
  float fVar258;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float t_1;
  float fVar259;
  float fVar267;
  float fVar268;
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar269;
  float fVar278;
  float fVar279;
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar280;
  float fVar286;
  float fVar287;
  vfloat4 a;
  float fVar288;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  float fVar289;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar299;
  float fVar300;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float s;
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined4 local_5bc;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  RTCIntersectArguments *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [8];
  float fStack_520;
  undefined4 uStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_4d8;
  ulong local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  RTCFilterFunctionNArguments local_498;
  ulong local_460;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  float fStack_420;
  float fStack_41c;
  undefined4 local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  uint local_408;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8 [4];
  Primitive *local_2a8;
  ulong local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 uVar117;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  
  PVar17 = prim[1];
  uVar63 = (ulong)(byte)PVar17;
  lVar73 = uVar63 * 0x25;
  pPVar8 = prim + lVar73 + 6;
  fVar164 = *(float *)(pPVar8 + 0xc);
  fVar165 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar164;
  fVar184 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar164;
  fVar185 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar164;
  fVar149 = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar163 = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar164 = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar67 = *(undefined4 *)(prim + uVar63 * 4 + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar64;
  auVar82._12_2_ = uVar118;
  auVar82._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar151._12_4_ = auVar82._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar64;
  auVar151._10_2_ = uVar118;
  auVar264._10_6_ = auVar151._10_6_;
  auVar264._8_2_ = uVar118;
  auVar264._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar40._4_8_ = auVar264._8_8_;
  auVar40._2_2_ = uVar118;
  auVar40._0_2_ = uVar118;
  fVar299 = (float)((int)sVar79 >> 8);
  fVar304 = (float)(auVar40._0_4_ >> 0x18);
  fVar305 = (float)(auVar264._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 5 + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar127._8_4_ = 0;
  auVar127._0_8_ = uVar64;
  auVar127._12_2_ = uVar118;
  auVar127._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar126._12_4_ = auVar127._12_4_;
  auVar126._8_2_ = 0;
  auVar126._0_8_ = uVar64;
  auVar126._10_2_ = uVar118;
  auVar125._10_6_ = auVar126._10_6_;
  auVar125._8_2_ = uVar118;
  auVar125._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar41._4_8_ = auVar125._8_8_;
  auVar41._2_2_ = uVar118;
  auVar41._0_2_ = uVar118;
  fVar186 = (float)((int)sVar79 >> 8);
  fVar202 = (float)(auVar41._0_4_ >> 0x18);
  fVar203 = (float)(auVar125._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 6 + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar130._8_4_ = 0;
  auVar130._0_8_ = uVar64;
  auVar130._12_2_ = uVar118;
  auVar130._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar129._12_4_ = auVar130._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar64;
  auVar129._10_2_ = uVar118;
  auVar128._10_6_ = auVar129._10_6_;
  auVar128._8_2_ = uVar118;
  auVar128._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar42._4_8_ = auVar128._8_8_;
  auVar42._2_2_ = uVar118;
  auVar42._0_2_ = uVar118;
  fVar226 = (float)((int)sVar79 >> 8);
  fVar232 = (float)(auVar42._0_4_ >> 0x18);
  fVar233 = (float)(auVar128._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0xf + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar64;
  auVar133._12_2_ = uVar118;
  auVar133._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar64;
  auVar132._10_2_ = uVar118;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = uVar118;
  auVar131._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar43._4_8_ = auVar131._8_8_;
  auVar43._2_2_ = uVar118;
  auVar43._0_2_ = uVar118;
  fVar80 = (float)((int)sVar79 >> 8);
  fVar119 = (float)(auVar43._0_4_ >> 0x18);
  fVar121 = (float)(auVar131._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar64;
  auVar207._12_2_ = uVar118;
  auVar207._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar64;
  auVar206._10_2_ = uVar118;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar118;
  auVar205._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar44._4_8_ = auVar205._8_8_;
  auVar44._2_2_ = uVar118;
  auVar44._0_2_ = uVar118;
  fVar234 = (float)((int)sVar79 >> 8);
  fVar250 = (float)(auVar44._0_4_ >> 0x18);
  fVar251 = (float)(auVar205._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar63 + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar64;
  auVar210._12_2_ = uVar118;
  auVar210._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar64;
  auVar209._10_2_ = uVar118;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar118;
  auVar208._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar45._4_8_ = auVar208._8_8_;
  auVar45._2_2_ = uVar118;
  auVar45._0_2_ = uVar118;
  fVar259 = (float)((int)sVar79 >> 8);
  fVar267 = (float)(auVar45._0_4_ >> 0x18);
  fVar268 = (float)(auVar208._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1a + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar64;
  auVar213._12_2_ = uVar118;
  auVar213._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar64;
  auVar212._10_2_ = uVar118;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar118;
  auVar211._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar46._4_8_ = auVar211._8_8_;
  auVar46._2_2_ = uVar118;
  auVar46._0_2_ = uVar118;
  fVar252 = (float)((int)sVar79 >> 8);
  fVar257 = (float)(auVar46._0_4_ >> 0x18);
  fVar258 = (float)(auVar211._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1b + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar64;
  auVar216._12_2_ = uVar118;
  auVar216._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar64;
  auVar215._10_2_ = uVar118;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar118;
  auVar214._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar47._4_8_ = auVar214._8_8_;
  auVar47._2_2_ = uVar118;
  auVar47._0_2_ = uVar118;
  fVar269 = (float)((int)sVar79 >> 8);
  fVar278 = (float)(auVar47._0_4_ >> 0x18);
  fVar279 = (float)(auVar214._8_4_ >> 0x18);
  uVar67 = *(undefined4 *)(prim + uVar63 * 0x1c + 6);
  uVar117 = (undefined1)((uint)uVar67 >> 0x18);
  uVar118 = CONCAT11(uVar117,uVar117);
  uVar117 = (undefined1)((uint)uVar67 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar118,uVar117),CONCAT14(uVar117,uVar67));
  uVar117 = (undefined1)((uint)uVar67 >> 8);
  uVar39 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar117),uVar117);
  sVar79 = CONCAT11((char)uVar67,(char)uVar67);
  uVar64 = CONCAT62(uVar39,sVar79);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar64;
  auVar219._12_2_ = uVar118;
  auVar219._14_2_ = uVar118;
  uVar118 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar64;
  auVar218._10_2_ = uVar118;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar118;
  auVar217._0_8_ = uVar64;
  uVar118 = (undefined2)uVar39;
  auVar48._4_8_ = auVar217._8_8_;
  auVar48._2_2_ = uVar118;
  auVar48._0_2_ = uVar118;
  fVar124 = (float)((int)sVar79 >> 8);
  fVar147 = (float)(auVar48._0_4_ >> 0x18);
  fVar148 = (float)(auVar217._8_4_ >> 0x18);
  fVar289 = fVar149 * fVar299 + fVar163 * fVar186 + fVar164 * fVar226;
  fVar296 = fVar149 * fVar304 + fVar163 * fVar202 + fVar164 * fVar232;
  fVar297 = fVar149 * fVar305 + fVar163 * fVar203 + fVar164 * fVar233;
  fVar298 = fVar149 * (float)(auVar151._12_4_ >> 0x18) +
            fVar163 * (float)(auVar126._12_4_ >> 0x18) + fVar164 * (float)(auVar129._12_4_ >> 0x18);
  fVar280 = fVar149 * fVar80 + fVar163 * fVar234 + fVar164 * fVar259;
  fVar286 = fVar149 * fVar119 + fVar163 * fVar250 + fVar164 * fVar267;
  fVar287 = fVar149 * fVar121 + fVar163 * fVar251 + fVar164 * fVar268;
  fVar288 = fVar149 * (float)(auVar132._12_4_ >> 0x18) +
            fVar163 * (float)(auVar206._12_4_ >> 0x18) + fVar164 * (float)(auVar209._12_4_ >> 0x18);
  fVar204 = fVar149 * fVar252 + fVar163 * fVar269 + fVar164 * fVar124;
  fVar224 = fVar149 * fVar257 + fVar163 * fVar278 + fVar164 * fVar147;
  fVar225 = fVar149 * fVar258 + fVar163 * fVar279 + fVar164 * fVar148;
  fVar164 = fVar149 * (float)(auVar212._12_4_ >> 0x18) +
            fVar163 * (float)(auVar215._12_4_ >> 0x18) + fVar164 * (float)(auVar218._12_4_ >> 0x18);
  fVar300 = fVar299 * fVar165 + fVar186 * fVar184 + fVar226 * fVar185;
  fVar304 = fVar304 * fVar165 + fVar202 * fVar184 + fVar232 * fVar185;
  fVar305 = fVar305 * fVar165 + fVar203 * fVar184 + fVar233 * fVar185;
  fVar306 = (float)(auVar151._12_4_ >> 0x18) * fVar165 +
            (float)(auVar126._12_4_ >> 0x18) * fVar184 + (float)(auVar129._12_4_ >> 0x18) * fVar185;
  fVar259 = fVar80 * fVar165 + fVar234 * fVar184 + fVar259 * fVar185;
  fVar267 = fVar119 * fVar165 + fVar250 * fVar184 + fVar267 * fVar185;
  fVar268 = fVar121 * fVar165 + fVar251 * fVar184 + fVar268 * fVar185;
  fVar299 = (float)(auVar132._12_4_ >> 0x18) * fVar165 +
            (float)(auVar206._12_4_ >> 0x18) * fVar184 + (float)(auVar209._12_4_ >> 0x18) * fVar185;
  fVar252 = fVar165 * fVar252 + fVar184 * fVar269 + fVar185 * fVar124;
  fVar257 = fVar165 * fVar257 + fVar184 * fVar278 + fVar185 * fVar147;
  fVar258 = fVar165 * fVar258 + fVar184 * fVar279 + fVar185 * fVar148;
  fVar269 = fVar165 * (float)(auVar212._12_4_ >> 0x18) +
            fVar184 * (float)(auVar215._12_4_ >> 0x18) + fVar185 * (float)(auVar218._12_4_ >> 0x18);
  uVar81 = (uint)DAT_01fec6c0;
  uVar120 = DAT_01fec6c0._4_4_;
  uVar122 = DAT_01fec6c0._8_4_;
  uVar123 = DAT_01fec6c0._12_4_;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar289 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar296 & uVar120));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar297 & uVar122));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar298 & uVar123));
  auVar290._0_4_ = (uint)fVar289 & uVar75;
  auVar290._4_4_ = (uint)fVar296 & uVar76;
  auVar290._8_4_ = (uint)fVar297 & uVar77;
  auVar290._12_4_ = (uint)fVar298 & uVar78;
  auVar166._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar166._8_4_ = ~uVar77 & 0x219392ef;
  auVar166._12_4_ = ~uVar78 & 0x219392ef;
  auVar166 = auVar166 | auVar290;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar280 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar286 & uVar120));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar287 & uVar122));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar288 & uVar123));
  auVar281._0_4_ = (uint)fVar280 & uVar75;
  auVar281._4_4_ = (uint)fVar286 & uVar76;
  auVar281._8_4_ = (uint)fVar287 & uVar77;
  auVar281._12_4_ = (uint)fVar288 & uVar78;
  auVar227._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar227._8_4_ = ~uVar77 & 0x219392ef;
  auVar227._12_4_ = ~uVar78 & 0x219392ef;
  auVar227 = auVar227 | auVar281;
  uVar75 = -(uint)(1e-18 <= (float)((uint)fVar204 & uVar81));
  uVar76 = -(uint)(1e-18 <= (float)((uint)fVar224 & uVar120));
  uVar77 = -(uint)(1e-18 <= (float)((uint)fVar225 & uVar122));
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar164 & uVar123));
  auVar220._0_4_ = (uint)fVar204 & uVar75;
  auVar220._4_4_ = (uint)fVar224 & uVar76;
  auVar220._8_4_ = (uint)fVar225 & uVar77;
  auVar220._12_4_ = (uint)fVar164 & uVar78;
  auVar235._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x219392ef219392ef;
  auVar235._8_4_ = ~uVar77 & 0x219392ef;
  auVar235._12_4_ = ~uVar78 & 0x219392ef;
  auVar235 = auVar235 | auVar220;
  auVar82 = rcpps(_DAT_01fec6c0,auVar166);
  fVar164 = auVar82._0_4_;
  fVar121 = auVar82._4_4_;
  fVar186 = auVar82._8_4_;
  fVar234 = auVar82._12_4_;
  fVar164 = (1.0 - auVar166._0_4_ * fVar164) * fVar164 + fVar164;
  fVar121 = (1.0 - auVar166._4_4_ * fVar121) * fVar121 + fVar121;
  fVar186 = (1.0 - auVar166._8_4_ * fVar186) * fVar186 + fVar186;
  fVar234 = (1.0 - auVar166._12_4_ * fVar234) * fVar234 + fVar234;
  auVar82 = rcpps(auVar82,auVar227);
  fVar80 = auVar82._0_4_;
  fVar124 = auVar82._4_4_;
  fVar202 = auVar82._8_4_;
  fVar250 = auVar82._12_4_;
  fVar80 = (1.0 - auVar227._0_4_ * fVar80) * fVar80 + fVar80;
  fVar124 = (1.0 - auVar227._4_4_ * fVar124) * fVar124 + fVar124;
  fVar202 = (1.0 - auVar227._8_4_ * fVar202) * fVar202 + fVar202;
  fVar250 = (1.0 - auVar227._12_4_ * fVar250) * fVar250 + fVar250;
  auVar82 = rcpps(auVar82,auVar235);
  fVar119 = auVar82._0_4_;
  fVar147 = auVar82._4_4_;
  fVar203 = auVar82._8_4_;
  fVar251 = auVar82._12_4_;
  fVar119 = (1.0 - auVar235._0_4_ * fVar119) * fVar119 + fVar119;
  fVar147 = (1.0 - auVar235._4_4_ * fVar147) * fVar147 + fVar147;
  fVar203 = (1.0 - auVar235._8_4_ * fVar203) * fVar203 + fVar203;
  fVar251 = (1.0 - auVar235._12_4_ * fVar251) * fVar251 + fVar251;
  fVar278 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar73 + 0x16)) *
            *(float *)(prim + lVar73 + 0x1a);
  uVar64 = *(ulong *)(prim + uVar63 * 7 + 6);
  uVar118 = (undefined2)(uVar64 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar64;
  auVar84._12_2_ = uVar118;
  auVar84._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar64 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar64;
  auVar83._10_2_ = uVar118;
  auVar242._10_6_ = auVar83._10_6_;
  auVar242._8_2_ = uVar118;
  auVar242._0_8_ = uVar64;
  uVar118 = (undefined2)(uVar64 >> 0x10);
  auVar49._4_8_ = auVar242._8_8_;
  auVar49._2_2_ = uVar118;
  auVar49._0_2_ = uVar118;
  fVar148 = (float)(auVar49._0_4_ >> 0x10);
  fVar204 = (float)(auVar242._8_4_ >> 0x10);
  uVar69 = *(ulong *)(prim + uVar63 * 0xb + 6);
  uVar118 = (undefined2)(uVar69 >> 0x30);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar69;
  auVar169._12_2_ = uVar118;
  auVar169._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar69 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar69;
  auVar168._10_2_ = uVar118;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar118;
  auVar167._0_8_ = uVar69;
  uVar118 = (undefined2)(uVar69 >> 0x10);
  auVar50._4_8_ = auVar167._8_8_;
  auVar50._2_2_ = uVar118;
  auVar50._0_2_ = uVar118;
  uVar9 = *(ulong *)(prim + uVar63 * 9 + 6);
  uVar118 = (undefined2)(uVar9 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar9;
  auVar87._12_2_ = uVar118;
  auVar87._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar9 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar9;
  auVar86._10_2_ = uVar118;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar118;
  auVar85._0_8_ = uVar9;
  uVar118 = (undefined2)(uVar9 >> 0x10);
  auVar51._4_8_ = auVar85._8_8_;
  auVar51._2_2_ = uVar118;
  auVar51._0_2_ = uVar118;
  fVar149 = (float)(auVar51._0_4_ >> 0x10);
  fVar224 = (float)(auVar85._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar63 * 0xd + 6);
  uVar118 = (undefined2)(uVar10 >> 0x30);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar10;
  auVar238._12_2_ = uVar118;
  auVar238._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar10 >> 0x20);
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._8_2_ = 0;
  auVar237._0_8_ = uVar10;
  auVar237._10_2_ = uVar118;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._8_2_ = uVar118;
  auVar236._0_8_ = uVar10;
  uVar118 = (undefined2)(uVar10 >> 0x10);
  auVar52._4_8_ = auVar236._8_8_;
  auVar52._2_2_ = uVar118;
  auVar52._0_2_ = uVar118;
  uVar11 = *(ulong *)(prim + uVar63 * 0x12 + 6);
  uVar118 = (undefined2)(uVar11 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar11;
  auVar90._12_2_ = uVar118;
  auVar90._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar11 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar11;
  auVar89._10_2_ = uVar118;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar118;
  auVar88._0_8_ = uVar11;
  uVar118 = (undefined2)(uVar11 >> 0x10);
  auVar53._4_8_ = auVar88._8_8_;
  auVar53._2_2_ = uVar118;
  auVar53._0_2_ = uVar118;
  fVar163 = (float)(auVar53._0_4_ >> 0x10);
  fVar225 = (float)(auVar88._8_4_ >> 0x10);
  uVar71 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar63 * 2 + uVar71 + 6);
  uVar118 = (undefined2)(uVar12 >> 0x30);
  auVar262._8_4_ = 0;
  auVar262._0_8_ = uVar12;
  auVar262._12_2_ = uVar118;
  auVar262._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar12 >> 0x20);
  auVar261._12_4_ = auVar262._12_4_;
  auVar261._8_2_ = 0;
  auVar261._0_8_ = uVar12;
  auVar261._10_2_ = uVar118;
  auVar260._10_6_ = auVar261._10_6_;
  auVar260._8_2_ = uVar118;
  auVar260._0_8_ = uVar12;
  uVar118 = (undefined2)(uVar12 >> 0x10);
  auVar54._4_8_ = auVar260._8_8_;
  auVar54._2_2_ = uVar118;
  auVar54._0_2_ = uVar118;
  uVar71 = *(ulong *)(prim + uVar71 + 6);
  uVar118 = (undefined2)(uVar71 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar71;
  auVar93._12_2_ = uVar118;
  auVar93._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar71 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar71;
  auVar92._10_2_ = uVar118;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar118;
  auVar91._0_8_ = uVar71;
  uVar118 = (undefined2)(uVar71 >> 0x10);
  auVar55._4_8_ = auVar91._8_8_;
  auVar55._2_2_ = uVar118;
  auVar55._0_2_ = uVar118;
  fVar165 = (float)(auVar55._0_4_ >> 0x10);
  fVar226 = (float)(auVar91._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar63 * 0x18 + 6);
  uVar118 = (undefined2)(uVar13 >> 0x30);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar13;
  auVar272._12_2_ = uVar118;
  auVar272._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar13 >> 0x20);
  auVar271._12_4_ = auVar272._12_4_;
  auVar271._8_2_ = 0;
  auVar271._0_8_ = uVar13;
  auVar271._10_2_ = uVar118;
  auVar270._10_6_ = auVar271._10_6_;
  auVar270._8_2_ = uVar118;
  auVar270._0_8_ = uVar13;
  uVar118 = (undefined2)(uVar13 >> 0x10);
  auVar56._4_8_ = auVar270._8_8_;
  auVar56._2_2_ = uVar118;
  auVar56._0_2_ = uVar118;
  uVar14 = *(ulong *)(prim + uVar63 * 0x1d + 6);
  uVar118 = (undefined2)(uVar14 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar14;
  auVar96._12_2_ = uVar118;
  auVar96._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar14 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar14;
  auVar95._10_2_ = uVar118;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar118;
  auVar94._0_8_ = uVar14;
  uVar118 = (undefined2)(uVar14 >> 0x10);
  auVar57._4_8_ = auVar94._8_8_;
  auVar57._2_2_ = uVar118;
  auVar57._0_2_ = uVar118;
  fVar184 = (float)(auVar57._0_4_ >> 0x10);
  fVar232 = (float)(auVar94._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar118 = (undefined2)(uVar15 >> 0x30);
  auVar284._8_4_ = 0;
  auVar284._0_8_ = uVar15;
  auVar284._12_2_ = uVar118;
  auVar284._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar15 >> 0x20);
  auVar283._12_4_ = auVar284._12_4_;
  auVar283._8_2_ = 0;
  auVar283._0_8_ = uVar15;
  auVar283._10_2_ = uVar118;
  auVar282._10_6_ = auVar283._10_6_;
  auVar282._8_2_ = uVar118;
  auVar282._0_8_ = uVar15;
  uVar118 = (undefined2)(uVar15 >> 0x10);
  auVar58._4_8_ = auVar282._8_8_;
  auVar58._2_2_ = uVar118;
  auVar58._0_2_ = uVar118;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar63) + 6);
  uVar118 = (undefined2)(uVar16 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar16;
  auVar99._12_2_ = uVar118;
  auVar99._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar16 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar16;
  auVar98._10_2_ = uVar118;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar118;
  auVar97._0_8_ = uVar16;
  uVar118 = (undefined2)(uVar16 >> 0x10);
  auVar59._4_8_ = auVar97._8_8_;
  auVar59._2_2_ = uVar118;
  auVar59._0_2_ = uVar118;
  fVar185 = (float)(auVar59._0_4_ >> 0x10);
  fVar233 = (float)(auVar97._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar63 * 0x23 + 6);
  uVar118 = (undefined2)(uVar63 >> 0x30);
  auVar293._8_4_ = 0;
  auVar293._0_8_ = uVar63;
  auVar293._12_2_ = uVar118;
  auVar293._14_2_ = uVar118;
  uVar118 = (undefined2)(uVar63 >> 0x20);
  auVar292._12_4_ = auVar293._12_4_;
  auVar292._8_2_ = 0;
  auVar292._0_8_ = uVar63;
  auVar292._10_2_ = uVar118;
  auVar291._10_6_ = auVar292._10_6_;
  auVar291._8_2_ = uVar118;
  auVar291._0_8_ = uVar63;
  uVar118 = (undefined2)(uVar63 >> 0x10);
  auVar60._4_8_ = auVar291._8_8_;
  auVar60._2_2_ = uVar118;
  auVar60._0_2_ = uVar118;
  auVar170._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar148) * fVar278 + fVar148) - fVar304) *
                fVar121,((((float)(int)(short)uVar69 - (float)(int)(short)uVar64) * fVar278 +
                         (float)(int)(short)uVar64) - fVar300) * fVar164);
  auVar170._8_4_ =
       ((((float)(auVar167._8_4_ >> 0x10) - fVar204) * fVar278 + fVar204) - fVar305) * fVar186;
  auVar170._12_4_ =
       ((((float)(auVar168._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar306) * fVar234;
  auVar239._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar278 + (float)(int)(short)uVar9
        ) - fVar300) * fVar164;
  auVar239._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar149) * fVar278 + fVar149) - fVar304) * fVar121;
  auVar239._8_4_ =
       ((((float)(auVar236._8_4_ >> 0x10) - fVar224) * fVar278 + fVar224) - fVar305) * fVar186;
  auVar239._12_4_ =
       ((((float)(auVar237._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar306) * fVar234;
  auVar263._0_8_ =
       CONCAT44(((((float)(auVar54._0_4_ >> 0x10) - fVar163) * fVar278 + fVar163) - fVar267) *
                fVar124,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar278 +
                         (float)(int)(short)uVar11) - fVar259) * fVar80);
  auVar263._8_4_ =
       ((((float)(auVar260._8_4_ >> 0x10) - fVar225) * fVar278 + fVar225) - fVar268) * fVar202;
  auVar263._12_4_ =
       ((((float)(auVar261._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar299) * fVar250;
  auVar273._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar71) * fVar278 +
        (float)(int)(short)uVar71) - fVar259) * fVar80;
  auVar273._4_4_ =
       ((((float)(auVar56._0_4_ >> 0x10) - fVar165) * fVar278 + fVar165) - fVar267) * fVar124;
  auVar273._8_4_ =
       ((((float)(auVar270._8_4_ >> 0x10) - fVar226) * fVar278 + fVar226) - fVar268) * fVar202;
  auVar273._12_4_ =
       ((((float)(auVar271._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar299) * fVar250;
  auVar285._0_8_ =
       CONCAT44(((((float)(auVar58._0_4_ >> 0x10) - fVar184) * fVar278 + fVar184) - fVar257) *
                fVar147,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar278 +
                         (float)(int)(short)uVar14) - fVar252) * fVar119);
  auVar285._8_4_ =
       ((((float)(auVar282._8_4_ >> 0x10) - fVar232) * fVar278 + fVar232) - fVar258) * fVar203;
  auVar285._12_4_ =
       ((((float)(auVar283._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar269) * fVar251;
  auVar294._0_4_ =
       ((((float)(int)(short)uVar63 - (float)(int)(short)uVar16) * fVar278 +
        (float)(int)(short)uVar16) - fVar252) * fVar119;
  auVar294._4_4_ =
       ((((float)(auVar60._0_4_ >> 0x10) - fVar185) * fVar278 + fVar185) - fVar257) * fVar147;
  auVar294._8_4_ =
       ((((float)(auVar291._8_4_ >> 0x10) - fVar233) * fVar278 + fVar233) - fVar258) * fVar203;
  auVar294._12_4_ =
       ((((float)(auVar292._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar269) * fVar251;
  auVar150._8_4_ = auVar170._8_4_;
  auVar150._0_8_ = auVar170._0_8_;
  auVar150._12_4_ = auVar170._12_4_;
  auVar151 = minps(auVar150,auVar239);
  auVar100._8_4_ = auVar263._8_4_;
  auVar100._0_8_ = auVar263._0_8_;
  auVar100._12_4_ = auVar263._12_4_;
  auVar82 = minps(auVar100,auVar273);
  auVar151 = maxps(auVar151,auVar82);
  auVar101._8_4_ = auVar285._8_4_;
  auVar101._0_8_ = auVar285._0_8_;
  auVar101._12_4_ = auVar285._12_4_;
  auVar82 = minps(auVar101,auVar294);
  uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar134._4_4_ = uVar67;
  auVar134._0_4_ = uVar67;
  auVar134._8_4_ = uVar67;
  auVar134._12_4_ = uVar67;
  auVar82 = maxps(auVar82,auVar134);
  auVar82 = maxps(auVar151,auVar82);
  auVar151 = maxps(auVar170,auVar239);
  auVar264 = maxps(auVar263,auVar273);
  auVar151 = minps(auVar151,auVar264);
  local_188 = auVar82._0_4_ * 0.99999964;
  fStack_184 = auVar82._4_4_ * 0.99999964;
  fStack_180 = auVar82._8_4_ * 0.99999964;
  fStack_17c = auVar82._12_4_ * 0.99999964;
  auVar82 = maxps(auVar285,auVar294);
  fVar164 = (ray->super_RayK<1>).tfar;
  auVar102._4_4_ = fVar164;
  auVar102._0_4_ = fVar164;
  auVar102._8_4_ = fVar164;
  auVar102._12_4_ = fVar164;
  auVar82 = minps(auVar82,auVar102);
  auVar82 = minps(auVar151,auVar82);
  uVar75 = (uint)(byte)PVar17;
  auVar135._0_4_ = -(uint)(uVar75 != 0 && local_188 <= auVar82._0_4_ * 1.0000004);
  auVar135._4_4_ = -(uint)(1 < uVar75 && fStack_184 <= auVar82._4_4_ * 1.0000004);
  auVar135._8_4_ = -(uint)(2 < uVar75 && fStack_180 <= auVar82._8_4_ * 1.0000004);
  auVar135._12_4_ = -(uint)(3 < uVar75 && fStack_17c <= auVar82._12_4_ * 1.0000004);
  uVar75 = movmskps(uVar75,auVar135);
  if (uVar75 == 0) {
    return;
  }
  uVar75 = uVar75 & 0xff;
  local_158._0_12_ = mm_lookupmask_ps._240_12_;
  local_158._12_4_ = 0;
  local_2a8 = prim;
LAB_00c1aab5:
  local_2a0 = (ulong)uVar75;
  lVar73 = 0;
  if (local_2a0 != 0) {
    for (; (uVar75 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
    }
  }
  local_550 = (RTCIntersectArguments *)(ulong)*(uint *)(local_2a8 + 2);
  local_4c0 = (ulong)*(uint *)(local_2a8 + lVar73 * 4 + 6);
  pGVar18 = (context->scene->geometries).items[(long)local_550].ptr;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                           local_4c0 *
                           pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_4a8 = pGVar18->fnumTimeSegments;
  fVar164 = (pGVar18->time_range).lower;
  fVar164 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar164) /
            ((pGVar18->time_range).upper - fVar164)) * local_4a8;
  _local_518 = ZEXT416((uint)fVar164);
  fVar164 = floorf(fVar164);
  if (local_4a8 + -1.0 <= fVar164) {
    fVar164 = local_4a8 + -1.0;
  }
  fVar80 = 0.0;
  if (0.0 <= fVar164) {
    fVar80 = fVar164;
  }
  fVar147 = (float)local_518._0_4_ - fVar80;
  fVar119 = 1.0 - fVar147;
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)fVar80 * 0x38;
  lVar73 = *(long *)(_Var19 + lVar72);
  lVar20 = *(long *)(_Var19 + 0x10 + lVar72);
  pRVar68 = (RTCIntersectArguments *)(lVar20 * (uVar64 + 3));
  lVar21 = *(long *)(_Var19 + 0x38 + lVar72);
  lVar72 = *(long *)(_Var19 + 0x48 + lVar72);
  lVar70 = lVar72 * (uVar64 + 3);
  pfVar2 = (float *)(lVar21 + uVar64 * lVar72);
  pfVar3 = (float *)(lVar73 + lVar20 * uVar64);
  local_4a8 = *pfVar3 * fVar119 + *pfVar2 * fVar147;
  fStack_4a4 = pfVar3[1] * fVar119 + pfVar2[1] * fVar147;
  fStack_4a0 = pfVar3[2] * fVar119 + pfVar2[2] * fVar147;
  pfVar4 = (float *)(lVar21 + (uVar64 + 1) * lVar72);
  pfVar5 = (float *)(lVar73 + lVar20 * (uVar64 + 1));
  local_438 = *pfVar5 * fVar119 + *pfVar4 * fVar147;
  fStack_434 = pfVar5[1] * fVar119 + pfVar4[1] * fVar147;
  fStack_430 = pfVar5[2] * fVar119 + pfVar4[2] * fVar147;
  pfVar6 = (float *)(lVar21 + (uVar64 + 2) * lVar72);
  pfVar7 = (float *)(lVar73 + lVar20 * (uVar64 + 2));
  local_258 = (ray->super_RayK<1>).org.field_0.m128[0];
  local_268 = (ray->super_RayK<1>).org.field_0.m128[1];
  local_278 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_3a8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3b8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_398 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar164 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_11c = local_3a8 * local_3a8;
  fVar121 = local_3b8 * local_3b8;
  fVar124 = local_398 * local_398;
  fVar164 = fVar164 * fVar164;
  fVar80 = fStack_11c + fVar121 + fVar124;
  auVar221._0_8_ = CONCAT44(fVar121 + fVar121 + fVar164,fVar80);
  auVar221._8_4_ = fVar124 + fVar121 + fVar124;
  auVar221._12_4_ = fVar164 + fVar121 + fVar164;
  auVar187._8_4_ = auVar221._8_4_;
  auVar187._0_8_ = auVar221._0_8_;
  auVar187._12_4_ = auVar221._12_4_;
  auVar82 = rcpss(auVar187,auVar221);
  local_368 = (2.0 - fVar80 * auVar82._0_4_) * auVar82._0_4_ *
              (((fStack_4a0 + fStack_430) * 0.5 - local_278) * local_398 +
              ((fStack_4a4 + fStack_434) * 0.5 - local_268) * local_3b8 +
              ((local_4a8 + local_438) * 0.5 - local_258) * local_3a8);
  local_2d8 = ZEXT416((uint)local_368);
  fStack_364 = local_368;
  fStack_360 = local_368;
  fStack_35c = local_368;
  local_258 = local_3a8 * local_368 + local_258;
  local_268 = local_3b8 * local_368 + local_268;
  local_278 = local_398 * local_368 + local_278;
  local_4a8 = local_4a8 - local_258;
  fStack_4a4 = fStack_4a4 - local_268;
  fStack_4a0 = fStack_4a0 - local_278;
  fStack_49c = (pfVar3[3] * fVar119 + pfVar2[3] * fVar147) - 0.0;
  local_448 = (*pfVar7 * fVar119 + *pfVar6 * fVar147) - local_258;
  fStack_444 = (pfVar7[1] * fVar119 + pfVar6[1] * fVar147) - local_268;
  fStack_440 = (pfVar7[2] * fVar119 + pfVar6[2] * fVar147) - local_278;
  fStack_43c = (pfVar7[3] * fVar119 + pfVar6[3] * fVar147) - 0.0;
  pfVar2 = (float *)((long)&pRVar68->flags + lVar73);
  pfVar3 = (float *)(lVar21 + lVar70);
  local_438 = local_438 - local_258;
  fStack_434 = fStack_434 - local_268;
  fStack_430 = fStack_430 - local_278;
  fStack_42c = (pfVar5[3] * fVar119 + pfVar4[3] * fVar147) - 0.0;
  local_258 = (fVar147 * *pfVar3 + fVar119 * *pfVar2) - local_258;
  local_268 = (fVar147 * pfVar3[1] + fVar119 * pfVar2[1]) - local_268;
  local_278 = (fVar147 * pfVar3[2] + fVar119 * pfVar2[2]) - local_278;
  fStack_50c = (fVar147 * pfVar3[3] + fVar119 * pfVar2[3]) - 0.0;
  local_1b8 = local_4a8;
  fStack_1b4 = local_4a8;
  fStack_1b0 = local_4a8;
  fStack_1ac = local_4a8;
  local_138 = fStack_4a4;
  fStack_134 = fStack_4a4;
  fStack_130 = fStack_4a4;
  fStack_12c = fStack_4a4;
  local_148 = fStack_4a0;
  fStack_144 = fStack_4a0;
  fStack_140 = fStack_4a0;
  fStack_13c = fStack_4a0;
  local_1c8 = fStack_49c;
  fStack_1c4 = fStack_49c;
  fStack_1c0 = fStack_49c;
  fStack_1bc = fStack_49c;
  local_1d8 = local_438;
  fStack_1d4 = local_438;
  fStack_1d0 = local_438;
  fStack_1cc = local_438;
  local_1e8 = fStack_434;
  fStack_1e4 = fStack_434;
  fStack_1e0 = fStack_434;
  fStack_1dc = fStack_434;
  local_1f8 = fStack_430;
  fStack_1f4 = fStack_430;
  fStack_1f0 = fStack_430;
  fStack_1ec = fStack_430;
  local_208 = fStack_42c;
  fStack_204 = fStack_42c;
  fStack_200 = fStack_42c;
  fStack_1fc = fStack_42c;
  local_128 = fStack_11c + fVar124 + fVar121;
  fStack_124 = fStack_11c + fVar124 + fVar121;
  fStack_120 = fStack_11c + fVar124 + fVar121;
  fStack_11c = fStack_11c + fVar124 + fVar121;
  local_218 = local_448;
  fStack_214 = local_448;
  fStack_210 = local_448;
  fStack_20c = local_448;
  local_228 = fStack_444;
  fStack_224 = fStack_444;
  fStack_220 = fStack_444;
  fStack_21c = fStack_444;
  local_238 = fStack_440;
  fStack_234 = fStack_440;
  fStack_230 = fStack_440;
  fStack_22c = fStack_440;
  local_248 = fStack_43c;
  fStack_244 = fStack_43c;
  fStack_240 = fStack_43c;
  fStack_23c = fStack_43c;
  fStack_254 = local_258;
  fStack_250 = local_258;
  fStack_24c = local_258;
  fStack_264 = local_268;
  fStack_260 = local_268;
  fStack_25c = local_268;
  fStack_274 = local_278;
  fStack_270 = local_278;
  fStack_26c = local_278;
  local_518._4_4_ = local_268;
  local_518._0_4_ = local_258;
  fStack_510 = local_278;
  local_288 = fStack_50c;
  fStack_284 = fStack_50c;
  fStack_280 = fStack_50c;
  fStack_27c = fStack_50c;
  fStack_3a4 = local_3a8;
  fStack_3a0 = local_3a8;
  fStack_39c = local_3a8;
  fStack_3b4 = local_3b8;
  fStack_3b0 = local_3b8;
  fStack_3ac = local_3b8;
  fStack_394 = local_398;
  fStack_390 = local_398;
  fStack_38c = local_398;
  local_298 = ABS(local_128);
  fStack_294 = ABS(fStack_124);
  fStack_290 = ABS(fStack_120);
  fStack_28c = ABS(fStack_11c);
  uVar64 = 1;
  local_460 = 1;
  fVar164 = 0.0;
  fVar80 = 1.0;
  uVar67 = 0;
  uVar62 = 0;
  uVar69 = 0;
  do {
    local_348 = fVar80 - fVar164;
    local_3c8 = fVar164;
    fStack_3c4 = fVar80;
    uStack_3c0 = uVar67;
    uStack_3bc = uVar62;
    fStack_344 = local_348;
    fStack_340 = local_348;
    fStack_33c = local_348;
    fVar148 = local_348 * 0.0 + fVar164;
    fVar149 = local_348 * 0.33333334 + fVar164;
    fVar163 = local_348 * 0.6666667 + fVar164;
    fVar165 = local_348 * 1.0 + fVar164;
    fVar234 = (float)DAT_01feca10;
    fVar233 = fVar234 - fVar148;
    fVar259 = DAT_01feca10._4_4_;
    fVar267 = fVar259 - fVar149;
    fVar257 = DAT_01feca10._8_4_;
    fVar286 = DAT_01feca10._12_4_;
    fVar252 = fVar257 - fVar163;
    fVar280 = fVar286 - fVar165;
    fVar80 = fVar148 * 3.0;
    fVar119 = fVar149 * 3.0;
    fVar121 = fVar163 * 3.0;
    fVar124 = fVar165 * 3.0;
    fVar203 = ((fVar233 * 3.0 + -5.0) * fVar233 * fVar233 + 2.0) * 0.5;
    fVar204 = ((fVar267 * 3.0 + -5.0) * fVar267 * fVar267 + 2.0) * 0.5;
    fVar278 = ((fVar252 * 3.0 + -5.0) * fVar252 * fVar252 + 2.0) * 0.5;
    fVar279 = ((fVar280 * 3.0 + -5.0) * fVar280 * fVar280 + 2.0) * 0.5;
    fVar184 = -fVar233 * fVar148 * fVar148 * 0.5;
    fVar186 = -fVar267 * fVar149 * fVar149 * 0.5;
    fVar224 = -fVar252 * fVar163 * fVar163 * 0.5;
    fVar226 = -fVar280 * fVar165 * fVar165 * 0.5;
    fVar289 = (fVar148 * fVar148 * (fVar80 + -5.0) + 2.0) * 0.5;
    fVar296 = (fVar149 * fVar149 * (fVar119 + -5.0) + 2.0) * 0.5;
    fVar297 = (fVar163 * fVar163 * (fVar121 + -5.0) + 2.0) * 0.5;
    fVar298 = (fVar165 * fVar165 * (fVar124 + -5.0) + 2.0) * 0.5;
    fVar147 = local_348 * 0.11111111;
    fVar185 = -fVar148 * fVar233 * fVar233 * 0.5;
    fVar202 = -fVar149 * fVar267 * fVar267 * 0.5;
    fVar225 = -fVar163 * fVar252 * fVar252 * 0.5;
    fVar232 = -fVar165 * fVar280 * fVar280 * 0.5;
    local_5a8 = local_1b8 * fVar185 +
                local_1d8 * fVar289 + local_218 * fVar203 + local_258 * fVar184;
    fStack_5a4 = fStack_1b4 * fVar202 +
                 fStack_1d4 * fVar296 + fStack_214 * fVar204 + fStack_254 * fVar186;
    fStack_5a0 = fStack_1b0 * fVar225 +
                 fStack_1d0 * fVar297 + fStack_210 * fVar278 + fStack_250 * fVar224;
    fStack_59c = fStack_1ac * fVar232 +
                 fStack_1cc * fVar298 + fStack_20c * fVar279 + fStack_24c * fVar226;
    fVar250 = local_138 * fVar185 + local_1e8 * fVar289 + local_228 * fVar203 + local_268 * fVar184;
    fVar268 = fStack_134 * fVar202 +
              fStack_1e4 * fVar296 + fStack_224 * fVar204 + fStack_264 * fVar186;
    fVar258 = fStack_130 * fVar225 +
              fStack_1e0 * fVar297 + fStack_220 * fVar278 + fStack_260 * fVar224;
    fVar287 = fStack_12c * fVar232 +
              fStack_1dc * fVar298 + fStack_21c * fVar279 + fStack_25c * fVar226;
    fVar251 = local_148 * fVar185 + local_1f8 * fVar289 + local_238 * fVar203 + local_278 * fVar184;
    fVar299 = fStack_144 * fVar202 +
              fStack_1f4 * fVar296 + fStack_234 * fVar204 + fStack_274 * fVar186;
    fVar269 = fStack_140 * fVar225 +
              fStack_1f0 * fVar297 + fStack_230 * fVar278 + fStack_270 * fVar224;
    fVar288 = fStack_13c * fVar232 +
              fStack_1ec * fVar298 + fStack_22c * fVar279 + fStack_26c * fVar226;
    fVar203 = fVar185 * local_1c8 + fVar289 * local_208 + fVar203 * local_248 + fVar184 * local_288;
    fVar204 = fVar202 * fStack_1c4 +
              fVar296 * fStack_204 + fVar204 * fStack_244 + fVar186 * fStack_284;
    auVar222._0_8_ = CONCAT44(fVar204,fVar203);
    auVar222._8_4_ =
         fVar225 * fStack_1c0 + fVar297 * fStack_200 + fVar278 * fStack_240 + fVar224 * fStack_280;
    auVar222._12_4_ =
         fVar232 * fStack_1bc + fVar298 * fStack_1fc + fVar279 * fStack_23c + fVar226 * fStack_27c;
    fVar224 = fVar148 * (fVar233 + fVar233);
    fVar226 = fVar149 * (fVar267 + fVar267);
    fVar278 = fVar163 * (fVar252 + fVar252);
    fVar289 = fVar165 * (fVar280 + fVar280);
    fVar225 = (fVar224 - fVar233 * fVar233) * 0.5;
    fVar232 = (fVar226 - fVar267 * fVar267) * 0.5;
    fVar279 = (fVar278 - fVar252 * fVar252) * 0.5;
    fVar296 = (fVar289 - fVar280 * fVar280) * 0.5;
    fVar184 = (fVar148 * fVar80 + (fVar148 + fVar148) * (fVar80 + -5.0)) * 0.5;
    fVar185 = (fVar149 * fVar119 + (fVar149 + fVar149) * (fVar119 + -5.0)) * 0.5;
    fVar186 = (fVar163 * fVar121 + (fVar163 + fVar163) * (fVar121 + -5.0)) * 0.5;
    fVar202 = (fVar165 * fVar124 + (fVar165 + fVar165) * (fVar124 + -5.0)) * 0.5;
    fVar80 = ((fVar80 + 2.0) * (fVar233 + fVar233) - fVar233 * 3.0 * fVar233) * 0.5;
    fVar119 = ((fVar119 + 2.0) * (fVar267 + fVar267) - fVar267 * 3.0 * fVar267) * 0.5;
    fVar121 = ((fVar121 + 2.0) * (fVar252 + fVar252) - fVar252 * 3.0 * fVar252) * 0.5;
    fVar124 = ((fVar124 + 2.0) * (fVar280 + fVar280) - fVar280 * 3.0 * fVar280) * 0.5;
    fVar148 = (fVar148 * fVar148 - fVar224) * 0.5;
    fVar149 = (fVar149 * fVar149 - fVar226) * 0.5;
    fVar163 = (fVar163 * fVar163 - fVar278) * 0.5;
    fVar165 = (fVar165 * fVar165 - fVar289) * 0.5;
    local_578 = (local_1b8 * fVar225 +
                local_1d8 * fVar184 + local_218 * fVar80 + local_258 * fVar148) * fVar147;
    fStack_574 = (fStack_1b4 * fVar232 +
                 fStack_1d4 * fVar185 + fStack_214 * fVar119 + fStack_254 * fVar149) * fVar147;
    fStack_570 = (fStack_1b0 * fVar279 +
                 fStack_1d0 * fVar186 + fStack_210 * fVar121 + fStack_250 * fVar163) * fVar147;
    fStack_56c = (fStack_1ac * fVar296 +
                 fStack_1cc * fVar202 + fStack_20c * fVar124 + fStack_24c * fVar165) * fVar147;
    local_4b8 = (local_138 * fVar225 +
                local_1e8 * fVar184 + local_228 * fVar80 + local_268 * fVar148) * fVar147;
    local_548 = (fStack_134 * fVar232 +
                fStack_1e4 * fVar185 + fStack_224 * fVar119 + fStack_264 * fVar149) * fVar147;
    fStack_544 = (fStack_130 * fVar279 +
                 fStack_1e0 * fVar186 + fStack_220 * fVar121 + fStack_260 * fVar163) * fVar147;
    fStack_540 = (fStack_12c * fVar296 +
                 fStack_1dc * fVar202 + fStack_21c * fVar124 + fStack_25c * fVar165) * fVar147;
    local_568 = (local_148 * fVar225 +
                local_1f8 * fVar184 + local_238 * fVar80 + local_278 * fVar148) * fVar147;
    fStack_564 = (fStack_144 * fVar232 +
                 fStack_1f4 * fVar185 + fStack_234 * fVar119 + fStack_274 * fVar149) * fVar147;
    fStack_560 = (fStack_140 * fVar279 +
                 fStack_1f0 * fVar186 + fStack_230 * fVar121 + fStack_270 * fVar163) * fVar147;
    fStack_55c = (fStack_13c * fVar296 +
                 fStack_1ec * fVar202 + fStack_22c * fVar124 + fStack_26c * fVar165) * fVar147;
    fVar119 = fVar147 * (fVar232 * fStack_1c4 +
                        fVar185 * fStack_204 + fVar119 * fStack_244 + fVar149 * fStack_284);
    fVar121 = fVar147 * (fVar279 * fStack_1c0 +
                        fVar186 * fStack_200 + fVar121 * fStack_240 + fVar163 * fStack_280);
    fVar124 = fVar147 * (fVar296 * fStack_1bc +
                        fVar202 * fStack_1fc + fVar124 * fStack_23c + fVar165 * fStack_27c);
    local_4d8.y = fStack_5a0;
    local_4d8.x = fStack_5a4;
    local_4d8.z = fStack_59c;
    local_4d8.field_3.a = 0;
    auVar26._4_4_ = fVar268;
    auVar26._0_4_ = fVar250;
    auVar26._8_4_ = fVar258;
    auVar26._12_4_ = fVar287;
    _local_528 = auVar26._4_12_;
    uStack_51c = 0;
    auVar27._4_4_ = fVar299;
    auVar27._0_4_ = fVar251;
    auVar27._8_4_ = fVar269;
    auVar27._12_4_ = fVar288;
    _local_5b8 = auVar27._4_12_;
    fStack_5ac = 0.0;
    auVar171._4_4_ = auVar222._8_4_;
    auVar171._0_4_ = fVar204;
    auVar171._8_4_ = auVar222._12_4_;
    auVar171._12_4_ = 0;
    auVar228._0_4_ =
         fVar203 + fVar147 * (fVar225 * local_1c8 +
                             fVar184 * local_208 + fVar80 * local_248 + fVar148 * local_288);
    auVar228._4_4_ = fVar204 + fVar119;
    auVar228._8_4_ = auVar222._8_4_ + fVar121;
    auVar228._12_4_ = auVar222._12_4_ + fVar124;
    auVar253._0_8_ = CONCAT44(auVar222._8_4_ - fVar121,fVar204 - fVar119);
    auVar253._8_4_ = auVar222._12_4_ - fVar124;
    auVar253._12_4_ = 0;
    local_358._0_4_ = fVar268 - fVar250;
    local_358._4_4_ = fVar258 - fVar268;
    local_358._8_4_ = fVar287 - fVar258;
    local_358._12_4_ = 0.0 - fVar287;
    local_388 = fVar299 - fVar251;
    fStack_384 = fVar269 - fVar299;
    fStack_380 = fVar288 - fVar269;
    fStack_37c = 0.0 - fVar288;
    fVar80 = local_4b8 * local_388 - local_568 * (float)local_358._0_4_;
    fVar119 = local_548 * fStack_384 - fStack_564 * (float)local_358._4_4_;
    fVar121 = fStack_544 * fStack_380 - fStack_560 * (float)local_358._8_4_;
    fVar124 = fStack_540 * fStack_37c - fStack_55c * (float)local_358._12_4_;
    local_3d8._0_4_ = fStack_5a4 - local_5a8;
    local_3d8._4_4_ = fStack_5a0 - fStack_5a4;
    fStack_3d0 = fStack_59c - fStack_5a0;
    fStack_3cc = 0.0 - fStack_59c;
    fVar165 = local_568 * (float)local_3d8._0_4_ - local_578 * local_388;
    fVar184 = fStack_564 * (float)local_3d8._4_4_ - fStack_574 * fStack_384;
    fVar185 = fStack_560 * fStack_3d0 - fStack_570 * fStack_380;
    fVar186 = fStack_55c * fStack_3cc - fStack_56c * fStack_37c;
    fVar202 = local_578 * (float)local_358._0_4_ - local_4b8 * (float)local_3d8._0_4_;
    fVar203 = fStack_574 * (float)local_358._4_4_ - local_548 * (float)local_3d8._4_4_;
    fVar204 = fStack_570 * (float)local_358._8_4_ - fStack_544 * fStack_3d0;
    fVar224 = fStack_56c * (float)local_358._12_4_ - fStack_540 * fStack_3cc;
    auVar240._0_4_ = (float)local_358._0_4_ * (float)local_358._0_4_ + local_388 * local_388;
    auVar240._4_4_ = (float)local_358._4_4_ * (float)local_358._4_4_ + fStack_384 * fStack_384;
    auVar240._8_4_ = (float)local_358._8_4_ * (float)local_358._8_4_ + fStack_380 * fStack_380;
    auVar240._12_4_ = (float)local_358._12_4_ * (float)local_358._12_4_ + fStack_37c * fStack_37c;
    auVar265._0_4_ = (float)local_3d8._0_4_ * (float)local_3d8._0_4_ + auVar240._0_4_;
    auVar265._4_4_ = (float)local_3d8._4_4_ * (float)local_3d8._4_4_ + auVar240._4_4_;
    auVar265._8_4_ = fStack_3d0 * fStack_3d0 + auVar240._8_4_;
    auVar265._12_4_ = fStack_3cc * fStack_3cc + auVar240._12_4_;
    auVar82 = rcpps(auVar240,auVar265);
    fVar147 = auVar82._0_4_;
    fVar148 = auVar82._4_4_;
    fVar149 = auVar82._8_4_;
    fVar163 = auVar82._12_4_;
    fVar147 = (1.0 - fVar147 * auVar265._0_4_) * fVar147 + fVar147;
    fVar148 = (1.0 - fVar148 * auVar265._4_4_) * fVar148 + fVar148;
    fVar149 = (1.0 - fVar149 * auVar265._8_4_) * fVar149 + fVar149;
    fVar163 = (1.0 - fVar163 * auVar265._12_4_) * fVar163 + fVar163;
    fVar225 = local_388 * local_548 - (float)local_358._0_4_ * fStack_564;
    fVar226 = fStack_384 * fStack_544 - (float)local_358._4_4_ * fStack_560;
    fVar232 = fStack_380 * fStack_540 - (float)local_358._8_4_ * fStack_55c;
    fVar233 = fStack_37c * 0.0 - (float)local_358._12_4_ * 0.0;
    local_588._4_4_ = fStack_560;
    local_588._0_4_ = fStack_564;
    fStack_580 = fStack_55c;
    fStack_57c = 0.0;
    fVar267 = (float)local_3d8._0_4_ * fStack_564 - local_388 * fStack_574;
    fVar252 = (float)local_3d8._4_4_ * fStack_560 - fStack_384 * fStack_570;
    fVar278 = fStack_3d0 * fStack_55c - fStack_380 * fStack_56c;
    fVar279 = fStack_3cc * 0.0 - fStack_37c * 0.0;
    fStack_53c = 0.0;
    fStack_4dc = 0.0;
    fVar280 = (float)local_358._0_4_ * fStack_574 - (float)local_3d8._0_4_ * local_548;
    fVar289 = (float)local_358._4_4_ * fStack_570 - (float)local_3d8._4_4_ * fStack_544;
    fVar296 = (float)local_358._8_4_ * fStack_56c - fStack_3d0 * fStack_540;
    fVar297 = (float)local_358._12_4_ * 0.0 - fStack_3cc * 0.0;
    auVar136._0_4_ = (fVar80 * fVar80 + fVar165 * fVar165 + fVar202 * fVar202) * fVar147;
    auVar136._4_4_ = (fVar119 * fVar119 + fVar184 * fVar184 + fVar203 * fVar203) * fVar148;
    auVar136._8_4_ = (fVar121 * fVar121 + fVar185 * fVar185 + fVar204 * fVar204) * fVar149;
    auVar136._12_4_ = (fVar124 * fVar124 + fVar186 * fVar186 + fVar224 * fVar224) * fVar163;
    auVar274._0_4_ = (fVar225 * fVar225 + fVar267 * fVar267 + fVar280 * fVar280) * fVar147;
    auVar274._4_4_ = (fVar226 * fVar226 + fVar252 * fVar252 + fVar289 * fVar289) * fVar148;
    auVar274._8_4_ = (fVar232 * fVar232 + fVar278 * fVar278 + fVar296 * fVar296) * fVar149;
    auVar274._12_4_ = (fVar233 * fVar233 + fVar279 * fVar279 + fVar297 * fVar297) * fVar163;
    auVar82 = maxps(auVar136,auVar274);
    auVar241._8_4_ = auVar222._8_4_;
    auVar241._0_8_ = auVar222._0_8_;
    auVar241._12_4_ = auVar222._12_4_;
    auVar264 = maxps(auVar241,auVar228);
    auVar188._8_4_ = auVar253._8_4_;
    auVar188._0_8_ = auVar253._0_8_;
    auVar188._12_4_ = 0;
    auVar151 = maxps(auVar188,auVar171);
    auVar242 = maxps(auVar264,auVar151);
    auVar151 = minps(auVar222,auVar228);
    auVar264 = minps(auVar253,auVar171);
    auVar264 = minps(auVar151,auVar264);
    auVar82 = sqrtps(auVar82,auVar82);
    auVar151 = rsqrtps(auVar82,auVar265);
    fVar80 = auVar151._0_4_;
    fVar121 = auVar151._4_4_;
    fVar147 = auVar151._8_4_;
    fVar149 = auVar151._12_4_;
    fVar119 = fVar80 * 1.5 - fVar80 * fVar80 * auVar265._0_4_ * 0.5 * fVar80;
    fVar124 = fVar121 * 1.5 - fVar121 * fVar121 * auVar265._4_4_ * 0.5 * fVar121;
    fVar148 = fVar147 * 1.5 - fVar147 * fVar147 * auVar265._8_4_ * 0.5 * fVar147;
    fVar163 = fVar149 * 1.5 - fVar149 * fVar149 * auVar265._12_4_ * 0.5 * fVar149;
    local_598._0_4_ = 0.0 - fVar250;
    local_598._4_4_ = 0.0 - fVar268;
    fStack_590 = 0.0 - fVar258;
    fStack_58c = 0.0 - fVar287;
    local_338 = 0.0 - fVar251;
    fStack_334 = 0.0 - fVar299;
    fStack_330 = 0.0 - fVar269;
    fStack_32c = 0.0 - fVar288;
    fVar202 = 0.0 - local_5a8;
    fVar203 = 0.0 - fStack_5a4;
    fVar204 = 0.0 - fStack_5a0;
    fVar224 = 0.0 - fStack_59c;
    fVar165 = local_3a8 * (float)local_3d8._0_4_ * fVar119 +
              local_3b8 * (float)local_358._0_4_ * fVar119 + local_398 * local_388 * fVar119;
    fVar184 = fStack_3a4 * (float)local_3d8._4_4_ * fVar124 +
              fStack_3b4 * (float)local_358._4_4_ * fVar124 + fStack_394 * fStack_384 * fVar124;
    fVar185 = fStack_3a0 * fStack_3d0 * fVar148 +
              fStack_3b0 * (float)local_358._8_4_ * fVar148 + fStack_390 * fStack_380 * fVar148;
    fVar186 = fStack_39c * fStack_3cc * fVar163 +
              fStack_3ac * (float)local_358._12_4_ * fVar163 + fStack_38c * fStack_37c * fVar163;
    local_2e8._0_4_ =
         (float)local_3d8._0_4_ * fVar119 * fVar202 +
         (float)local_358._0_4_ * fVar119 * (float)local_598._0_4_ + local_388 * fVar119 * local_338
    ;
    local_2e8._4_4_ =
         (float)local_3d8._4_4_ * fVar124 * fVar203 +
         (float)local_358._4_4_ * fVar124 * (float)local_598._4_4_ +
         fStack_384 * fVar124 * fStack_334;
    local_2e8._8_4_ =
         fStack_3d0 * fVar148 * fVar204 +
         (float)local_358._8_4_ * fVar148 * fStack_590 + fStack_380 * fVar148 * fStack_330;
    local_2e8._12_4_ =
         fStack_3cc * fVar163 * fVar224 +
         (float)local_358._12_4_ * fVar163 * fStack_58c + fStack_37c * fVar163 * fStack_32c;
    local_458._0_4_ =
         (local_3a8 * fVar202 + local_3b8 * (float)local_598._0_4_ + local_398 * local_338) -
         fVar165 * (float)local_2e8._0_4_;
    local_458._4_4_ =
         (fStack_3a4 * fVar203 + fStack_3b4 * (float)local_598._4_4_ + fStack_394 * fStack_334) -
         fVar184 * (float)local_2e8._4_4_;
    fStack_450 = (fStack_3a0 * fVar204 + fStack_3b0 * fStack_590 + fStack_390 * fStack_330) -
                 fVar185 * (float)local_2e8._8_4_;
    fStack_44c = (fStack_39c * fVar224 + fStack_3ac * fStack_58c + fStack_38c * fStack_32c) -
                 fVar186 * (float)local_2e8._12_4_;
    local_538._0_4_ =
         (fVar202 * fVar202 +
         (float)local_598._0_4_ * (float)local_598._0_4_ + local_338 * local_338) -
         (float)local_2e8._0_4_ * (float)local_2e8._0_4_;
    local_538._4_4_ =
         (fVar203 * fVar203 +
         (float)local_598._4_4_ * (float)local_598._4_4_ + fStack_334 * fStack_334) -
         (float)local_2e8._4_4_ * (float)local_2e8._4_4_;
    fStack_530 = (fVar204 * fVar204 + fStack_590 * fStack_590 + fStack_330 * fStack_330) -
                 (float)local_2e8._8_4_ * (float)local_2e8._8_4_;
    fStack_52c = (fVar224 * fVar224 + fStack_58c * fStack_58c + fStack_32c * fStack_32c) -
                 (float)local_2e8._12_4_ * (float)local_2e8._12_4_;
    fVar80 = (auVar242._0_4_ + auVar82._0_4_) * 1.0000002;
    fVar121 = (auVar242._4_4_ + auVar82._4_4_) * 1.0000002;
    fVar147 = (auVar242._8_4_ + auVar82._8_4_) * 1.0000002;
    fVar149 = (auVar242._12_4_ + auVar82._12_4_) * 1.0000002;
    fVar267 = (float)local_538._0_4_ - fVar80 * fVar80;
    fVar252 = (float)local_538._4_4_ - fVar121 * fVar121;
    fVar278 = fStack_530 - fVar147 * fVar147;
    fVar279 = fStack_52c - fVar149 * fVar149;
    local_3e8._0_4_ = fVar165 * fVar165;
    local_3e8._4_4_ = fVar184 * fVar184;
    fStack_3e0 = fVar185 * fVar185;
    fStack_3dc = fVar186 * fVar186;
    fVar80 = local_128 - (float)local_3e8._0_4_;
    fVar121 = fStack_124 - (float)local_3e8._4_4_;
    fVar147 = fStack_120 - fStack_3e0;
    fVar149 = fStack_11c - fStack_3dc;
    local_458._0_4_ = (float)local_458._0_4_ + (float)local_458._0_4_;
    local_458._4_4_ = (float)local_458._4_4_ + (float)local_458._4_4_;
    fStack_450 = fStack_450 + fStack_450;
    fStack_44c = fStack_44c + fStack_44c;
    local_508._0_4_ = (float)local_458._0_4_ * (float)local_458._0_4_;
    local_508._4_4_ = (float)local_458._4_4_ * (float)local_458._4_4_;
    fStack_500 = fStack_450 * fStack_450;
    fStack_4fc = fStack_44c * fStack_44c;
    fVar225 = fVar80 * 4.0;
    fVar226 = fVar121 * 4.0;
    fVar232 = fVar147 * 4.0;
    fVar233 = fVar149 * 4.0;
    auVar243._0_4_ = (float)local_508._0_4_ - fVar225 * fVar267;
    auVar243._4_4_ = (float)local_508._4_4_ - fVar226 * fVar252;
    auVar243._8_4_ = fStack_500 - fVar232 * fVar278;
    auVar243._12_4_ = fStack_4fc - fVar233 * fVar279;
    auVar172._4_4_ = -(uint)(0.0 <= auVar243._4_4_);
    auVar172._0_4_ = -(uint)(0.0 <= auVar243._0_4_);
    auVar172._8_4_ = -(uint)(0.0 <= auVar243._8_4_);
    auVar172._12_4_ = -(uint)(0.0 <= auVar243._12_4_);
    uVar67 = 0;
    iVar61 = movmskps((int)uVar64,auVar172);
    if (iVar61 == 0) {
      iVar61 = 0;
      auVar190 = _DAT_01feb9f0;
      auVar275 = _DAT_01feba00;
    }
    else {
      auVar242 = sqrtps(local_358,auVar243);
      bVar22 = 0.0 <= auVar243._0_4_;
      uVar75 = -(uint)bVar22;
      bVar74 = 0.0 <= auVar243._4_4_;
      uVar76 = -(uint)bVar74;
      bVar23 = 0.0 <= auVar243._8_4_;
      uVar77 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar243._12_4_;
      uVar78 = -(uint)bVar24;
      auVar189._0_4_ = fVar80 + fVar80;
      auVar189._4_4_ = fVar121 + fVar121;
      auVar189._8_4_ = fVar147 + fVar147;
      auVar189._12_4_ = fVar149 + fVar149;
      auVar151 = rcpps(local_2e8,auVar189);
      fVar280 = auVar151._0_4_;
      fVar296 = auVar151._4_4_;
      fVar298 = auVar151._8_4_;
      fVar304 = auVar151._12_4_;
      fVar280 = (1.0 - auVar189._0_4_ * fVar280) * fVar280 + fVar280;
      fVar296 = (1.0 - auVar189._4_4_ * fVar296) * fVar296 + fVar296;
      fVar298 = (1.0 - auVar189._8_4_ * fVar298) * fVar298 + fVar298;
      fVar304 = (1.0 - auVar189._12_4_ * fVar304) * fVar304 + fVar304;
      fVar289 = (-(float)local_458._0_4_ - auVar242._0_4_) * fVar280;
      fVar297 = (-(float)local_458._4_4_ - auVar242._4_4_) * fVar296;
      fVar300 = (-fStack_450 - auVar242._8_4_) * fVar298;
      fVar305 = (-fStack_44c - auVar242._12_4_) * fVar304;
      fVar280 = (auVar242._0_4_ - (float)local_458._0_4_) * fVar280;
      fVar296 = (auVar242._4_4_ - (float)local_458._4_4_) * fVar296;
      fVar298 = (auVar242._8_4_ - fStack_450) * fVar298;
      fVar304 = (auVar242._12_4_ - fStack_44c) * fVar304;
      local_2b8[0] = (fVar165 * fVar289 + (float)local_2e8._0_4_) * fVar119;
      local_2b8[1] = (fVar184 * fVar297 + (float)local_2e8._4_4_) * fVar124;
      local_2b8[2] = (fVar185 * fVar300 + (float)local_2e8._8_4_) * fVar148;
      local_2b8[3] = (fVar186 * fVar305 + (float)local_2e8._12_4_) * fVar163;
      local_2c8._4_4_ = (fVar184 * fVar296 + (float)local_2e8._4_4_) * fVar124;
      local_2c8._0_4_ = (fVar165 * fVar280 + (float)local_2e8._0_4_) * fVar119;
      fStack_2c0 = (fVar185 * fVar298 + (float)local_2e8._8_4_) * fVar148;
      fStack_2bc = (fVar186 * fVar304 + (float)local_2e8._12_4_) * fVar163;
      auVar254._0_4_ = (uint)fVar289 & uVar75;
      auVar254._4_4_ = (uint)fVar297 & uVar76;
      auVar254._8_4_ = (uint)fVar300 & uVar77;
      auVar254._12_4_ = (uint)fVar305 & uVar78;
      auVar190._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x7f8000007f800000;
      auVar190._8_4_ = ~uVar77 & 0x7f800000;
      auVar190._12_4_ = ~uVar78 & 0x7f800000;
      auVar190 = auVar190 | auVar254;
      auVar307._0_4_ = (uint)fVar280 & uVar75;
      auVar307._4_4_ = (uint)fVar296 & uVar76;
      auVar307._8_4_ = (uint)fVar298 & uVar77;
      auVar307._12_4_ = (uint)fVar304 & uVar78;
      auVar275._0_8_ = CONCAT44(~uVar76,~uVar75) & 0xff800000ff800000;
      auVar275._8_4_ = ~uVar77 & 0xff800000;
      auVar275._12_4_ = ~uVar78 & 0xff800000;
      auVar275 = auVar275 | auVar307;
      auVar255._0_8_ = CONCAT44(local_3e8._4_4_,local_3e8._0_4_) & 0x7fffffff7fffffff;
      auVar255._8_4_ = ABS(fStack_3e0);
      auVar255._12_4_ = ABS(fStack_3dc);
      auVar37._4_4_ = fStack_294;
      auVar37._0_4_ = local_298;
      auVar37._8_4_ = fStack_290;
      auVar37._12_4_ = fStack_28c;
      auVar151 = maxps(auVar37,auVar255);
      fVar280 = auVar151._0_4_ * 1.9073486e-06;
      fVar289 = auVar151._4_4_ * 1.9073486e-06;
      fVar296 = auVar151._8_4_ * 1.9073486e-06;
      fVar297 = auVar151._12_4_ * 1.9073486e-06;
      auVar308._0_4_ = -(uint)(ABS(fVar80) < fVar280 && bVar22);
      auVar308._4_4_ = -(uint)(ABS(fVar121) < fVar289 && bVar74);
      auVar308._8_4_ = -(uint)(ABS(fVar147) < fVar296 && bVar23);
      auVar308._12_4_ = -(uint)(ABS(fVar149) < fVar297 && bVar24);
      iVar61 = movmskps(iVar61,auVar308);
      if (iVar61 != 0) {
        uVar75 = -(uint)(fVar267 <= 0.0);
        uVar76 = -(uint)(fVar252 <= 0.0);
        uVar77 = -(uint)(fVar278 <= 0.0);
        uVar78 = -(uint)(fVar279 <= 0.0);
        auVar295._0_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar308._0_4_;
        auVar295._4_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar308._4_4_;
        auVar295._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar308._8_4_;
        auVar295._12_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar308._12_4_;
        auVar137._0_4_ = ~auVar308._0_4_ & auVar190._0_4_;
        auVar137._4_4_ = ~auVar308._4_4_ & auVar190._4_4_;
        auVar137._8_4_ = ~auVar308._8_4_ & auVar190._8_4_;
        auVar137._12_4_ = ~auVar308._12_4_ & auVar190._12_4_;
        auVar191._0_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar308._0_4_;
        auVar191._4_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar308._4_4_;
        auVar191._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar308._8_4_;
        auVar191._12_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar308._12_4_;
        auVar309._0_4_ = ~auVar308._0_4_ & auVar275._0_4_;
        auVar309._4_4_ = ~auVar308._4_4_ & auVar275._4_4_;
        auVar309._8_4_ = ~auVar308._8_4_ & auVar275._8_4_;
        auVar309._12_4_ = ~auVar308._12_4_ & auVar275._12_4_;
        auVar172._4_4_ = -(uint)((fVar289 <= ABS(fVar121) || fVar252 <= 0.0) && bVar74);
        auVar172._0_4_ = -(uint)((fVar280 <= ABS(fVar80) || fVar267 <= 0.0) && bVar22);
        auVar172._8_4_ = -(uint)((fVar296 <= ABS(fVar147) || fVar278 <= 0.0) && bVar23);
        auVar172._12_4_ = -(uint)((fVar297 <= ABS(fVar149) || fVar279 <= 0.0) && bVar24);
        auVar190 = auVar137 | auVar295;
        auVar275 = auVar309 | auVar191;
      }
    }
    auVar173._0_4_ = (auVar172._0_4_ << 0x1f) >> 0x1f;
    auVar173._4_4_ = (auVar172._4_4_ << 0x1f) >> 0x1f;
    auVar173._8_4_ = (auVar172._8_4_ << 0x1f) >> 0x1f;
    auVar173._12_4_ = (auVar172._12_4_ << 0x1f) >> 0x1f;
    auVar173 = auVar173 & local_158;
    iVar61 = movmskps(iVar61,auVar173);
    uVar64 = uVar69;
    local_4f8 = fVar164;
    fStack_4f4 = fVar164;
    fStack_4f0 = fVar164;
    fStack_4ec = fVar164;
    local_4e8 = fStack_574;
    fStack_4e4 = fStack_570;
    fStack_4e0 = fStack_56c;
    fStack_4b4 = local_548;
    fStack_4b0 = fStack_544;
    fStack_4ac = fStack_540;
    if (iVar61 != 0) {
      local_2f8 = fVar225;
      fStack_2f4 = fVar226;
      fStack_2f0 = fVar232;
      fStack_2ec = fVar233;
      local_3f8._4_4_ = (auVar264._4_4_ - auVar82._4_4_) * 0.99999976;
      local_3f8._0_4_ = (auVar264._0_4_ - auVar82._0_4_) * 0.99999976;
      fStack_3f0 = (auVar264._8_4_ - auVar82._8_4_) * 0.99999976;
      fStack_3ec = (auVar264._12_4_ - auVar82._12_4_) * 0.99999976;
      local_178 = fVar165;
      fStack_174 = fVar184;
      fStack_170 = fVar185;
      fStack_16c = fVar186;
      local_168 = fVar119;
      fStack_164 = fVar124;
      fStack_160 = fVar148;
      fStack_15c = fVar163;
      local_328._4_4_ = fVar121;
      local_328._0_4_ = fVar80;
      fStack_320 = fVar147;
      fStack_31c = fVar149;
      auVar244._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2d8._0_4_;
      auVar244._4_4_ = auVar244._0_4_;
      auVar244._8_4_ = auVar244._0_4_;
      auVar244._12_4_ = auVar244._0_4_;
      auVar264 = maxps(auVar244,auVar190);
      auVar223._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2d8._0_4_;
      auVar223._4_4_ = auVar223._0_4_;
      auVar223._8_4_ = auVar223._0_4_;
      auVar223._12_4_ = auVar223._0_4_;
      auVar151 = minps(auVar223,auVar275);
      auVar103._0_4_ = local_4b8 * local_3b8 + local_568 * local_398;
      auVar103._4_4_ = local_548 * fStack_3b4 + fStack_564 * fStack_394;
      auVar103._8_4_ = fStack_544 * fStack_3b0 + fStack_560 * fStack_390;
      auVar103._12_4_ = fStack_540 * fStack_3ac + fStack_55c * fStack_38c;
      auVar301._0_4_ = local_578 * local_3a8 + auVar103._0_4_;
      auVar301._4_4_ = fStack_574 * fStack_3a4 + auVar103._4_4_;
      auVar301._8_4_ = fStack_570 * fStack_3a0 + auVar103._8_4_;
      auVar301._12_4_ = fStack_56c * fStack_39c + auVar103._12_4_;
      auVar82 = rcpps(auVar103,auVar301);
      fVar267 = auVar82._0_4_;
      fVar252 = auVar82._4_4_;
      fVar278 = auVar82._8_4_;
      fVar279 = auVar82._12_4_;
      fVar202 = ((fVar234 - auVar301._0_4_ * fVar267) * fVar267 + fVar267) *
                -(fVar202 * local_578 + (float)local_598._0_4_ * local_4b8 + local_338 * local_568);
      fVar203 = ((fVar259 - auVar301._4_4_ * fVar252) * fVar252 + fVar252) *
                -(fVar203 * fStack_574 +
                 (float)local_598._4_4_ * local_548 + fStack_334 * fStack_564);
      fVar204 = ((fVar257 - auVar301._8_4_ * fVar278) * fVar278 + fVar278) *
                -(fVar204 * fStack_570 + fStack_590 * fStack_544 + fStack_330 * fStack_560);
      fVar224 = ((fVar286 - auVar301._12_4_ * fVar279) * fVar279 + fVar279) *
                -(fVar224 * fStack_56c + fStack_58c * fStack_540 + fStack_32c * fStack_55c);
      uVar75 = -(uint)(auVar301._0_4_ < 0.0 || ABS(auVar301._0_4_) < 1e-18);
      uVar76 = -(uint)(auVar301._4_4_ < 0.0 || ABS(auVar301._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar301._8_4_ < 0.0 || ABS(auVar301._8_4_) < 1e-18);
      uVar78 = -(uint)(auVar301._12_4_ < 0.0 || ABS(auVar301._12_4_) < 1e-18);
      auVar192._0_8_ = CONCAT44(uVar76,uVar75) & 0xff800000ff800000;
      auVar192._8_4_ = uVar77 & 0xff800000;
      auVar192._12_4_ = uVar78 & 0xff800000;
      auVar104._0_4_ = ~uVar75 & (uint)fVar202;
      auVar104._4_4_ = ~uVar76 & (uint)fVar203;
      auVar104._8_4_ = ~uVar77 & (uint)fVar204;
      auVar104._12_4_ = ~uVar78 & (uint)fVar224;
      auVar264 = maxps(auVar264,auVar104 | auVar192);
      uVar75 = -(uint)(0.0 < auVar301._0_4_ || ABS(auVar301._0_4_) < 1e-18);
      uVar76 = -(uint)(0.0 < auVar301._4_4_ || ABS(auVar301._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar301._8_4_ || ABS(auVar301._8_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar301._12_4_ || ABS(auVar301._12_4_) < 1e-18);
      auVar105._0_8_ = CONCAT44(uVar76,uVar75) & 0x7f8000007f800000;
      auVar105._8_4_ = uVar77 & 0x7f800000;
      auVar105._12_4_ = uVar78 & 0x7f800000;
      auVar302._0_4_ = ~uVar75 & (uint)fVar202;
      auVar302._4_4_ = ~uVar76 & (uint)fVar203;
      auVar302._8_4_ = ~uVar77 & (uint)fVar204;
      auVar302._12_4_ = ~uVar78 & (uint)fVar224;
      auVar151 = minps(auVar151,auVar302 | auVar105);
      auVar138._0_4_ = (0.0 - fVar268) * -local_548 + (0.0 - fVar299) * -fStack_564;
      auVar138._4_4_ = (0.0 - fVar258) * -fStack_544 + (0.0 - fVar269) * -fStack_560;
      auVar138._8_4_ = (0.0 - fVar287) * -fStack_540 + (0.0 - fVar288) * -fStack_55c;
      auVar138._12_4_ = 0x80000000;
      auVar312._0_4_ = -fStack_574 * local_3a8 + -local_548 * local_3b8 + -fStack_564 * local_398;
      auVar312._4_4_ =
           -fStack_570 * fStack_3a4 + -fStack_544 * fStack_3b4 + -fStack_560 * fStack_394;
      auVar312._8_4_ =
           -fStack_56c * fStack_3a0 + -fStack_540 * fStack_3b0 + -fStack_55c * fStack_390;
      auVar312._12_4_ = fStack_39c * -0.0 + fStack_3ac * -0.0 + fStack_38c * -0.0;
      auVar82 = rcpps(auVar138,auVar312);
      fVar202 = auVar82._0_4_;
      fVar203 = auVar82._4_4_;
      fVar204 = auVar82._8_4_;
      fVar224 = auVar82._12_4_;
      fVar202 = ((fVar234 - auVar312._0_4_ * fVar202) * fVar202 + fVar202) *
                -((0.0 - fStack_5a4) * -fStack_574 + auVar138._0_4_);
      fVar203 = ((fVar259 - auVar312._4_4_ * fVar203) * fVar203 + fVar203) *
                -((0.0 - fStack_5a0) * -fStack_570 + auVar138._4_4_);
      fVar204 = ((fVar257 - auVar312._8_4_ * fVar204) * fVar204 + fVar204) *
                -((0.0 - fStack_59c) * -fStack_56c + auVar138._8_4_);
      fVar224 = ((fVar286 - auVar312._12_4_ * fVar224) * fVar224 + fVar224) * 0.0;
      uVar75 = -(uint)(auVar312._0_4_ < 0.0 || ABS(auVar312._0_4_) < 1e-18);
      uVar76 = -(uint)(auVar312._4_4_ < 0.0 || ABS(auVar312._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar312._8_4_ < 0.0 || ABS(auVar312._8_4_) < 1e-18);
      uVar78 = -(uint)(auVar312._12_4_ < 0.0 || ABS(auVar312._12_4_) < 1e-18);
      auVar139._0_8_ = CONCAT44(uVar76,uVar75) & 0xff800000ff800000;
      auVar139._8_4_ = uVar77 & 0xff800000;
      auVar139._12_4_ = uVar78 & 0xff800000;
      auVar106._0_4_ = ~uVar75 & (uint)fVar202;
      auVar106._4_4_ = ~uVar76 & (uint)fVar203;
      auVar106._8_4_ = ~uVar77 & (uint)fVar204;
      auVar106._12_4_ = ~uVar78 & (uint)fVar224;
      local_378 = maxps(auVar264,auVar106 | auVar139);
      uVar75 = -(uint)(0.0 < auVar312._0_4_ || ABS(auVar312._0_4_) < 1e-18);
      uVar76 = -(uint)(0.0 < auVar312._4_4_ || ABS(auVar312._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar312._8_4_ || ABS(auVar312._8_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar312._12_4_ || ABS(auVar312._12_4_) < 1e-18);
      auVar107._0_8_ = CONCAT44(uVar76,uVar75) & 0x7f8000007f800000;
      auVar107._8_4_ = uVar77 & 0x7f800000;
      auVar107._12_4_ = uVar78 & 0x7f800000;
      auVar313._0_4_ = ~uVar75 & (uint)fVar202;
      auVar313._4_4_ = ~uVar76 & (uint)fVar203;
      auVar313._8_4_ = ~uVar77 & (uint)fVar204;
      auVar313._12_4_ = ~uVar78 & (uint)fVar224;
      local_4d8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  minps(auVar151,auVar313 | auVar107);
      fVar202 = local_378._12_4_;
      fVar203 = local_378._0_4_;
      fVar204 = local_378._4_4_;
      fVar224 = local_378._8_4_;
      auVar303._0_4_ = -(uint)(fVar203 <= local_4d8.x) & auVar173._0_4_;
      auVar303._4_4_ = -(uint)(fVar204 <= local_4d8.y) & auVar173._4_4_;
      auVar303._8_4_ = -(uint)(fVar224 <= local_4d8.z) & auVar173._8_4_;
      auVar303._12_4_ = -(uint)(fVar202 <= local_4d8.field_3.w) & auVar173._12_4_;
      iVar61 = movmskps(iVar61,auVar303);
      if (iVar61 != 0) {
        auVar82 = maxps(ZEXT816(0),_local_3f8);
        auVar36._4_4_ = local_2b8[1];
        auVar36._0_4_ = local_2b8[0];
        auVar36._8_4_ = local_2b8[2];
        auVar36._12_4_ = local_2b8[3];
        auVar151 = minps(auVar36,_DAT_01feca10);
        auVar229._0_12_ = ZEXT812(0);
        auVar229._12_4_ = 0;
        auVar151 = maxps(auVar151,auVar229);
        auVar264 = minps(_local_2c8,_DAT_01feca10);
        auVar264 = maxps(auVar264,auVar229);
        local_2b8[0] = (auVar151._0_4_ + 0.0) * 0.25 * local_348 + fVar164;
        local_2b8[1] = (auVar151._4_4_ + 1.0) * 0.25 * local_348 + fVar164;
        local_2b8[2] = (auVar151._8_4_ + 2.0) * 0.25 * local_348 + fVar164;
        local_2b8[3] = (auVar151._12_4_ + 3.0) * 0.25 * local_348 + fVar164;
        local_2c8._0_4_ = (auVar264._0_4_ + 0.0) * 0.25 * local_348 + fVar164;
        local_2c8._4_4_ = (auVar264._4_4_ + 1.0) * 0.25 * local_348 + fVar164;
        fStack_2c0 = (auVar264._8_4_ + 2.0) * 0.25 * local_348 + fVar164;
        fStack_2bc = (auVar264._12_4_ + 3.0) * 0.25 * local_348 + fVar164;
        auVar152._0_4_ = (float)local_538._0_4_ - auVar82._0_4_ * auVar82._0_4_;
        auVar152._4_4_ = (float)local_538._4_4_ - auVar82._4_4_ * auVar82._4_4_;
        auVar152._8_4_ = fStack_530 - auVar82._8_4_ * auVar82._8_4_;
        auVar152._12_4_ = fStack_52c - auVar82._12_4_ * auVar82._12_4_;
        auVar245._0_4_ = (float)local_508._0_4_ - fVar225 * auVar152._0_4_;
        auVar245._4_4_ = (float)local_508._4_4_ - fVar226 * auVar152._4_4_;
        auVar245._8_4_ = fStack_500 - fVar232 * auVar152._8_4_;
        auVar245._12_4_ = fStack_4fc - fVar233 * auVar152._12_4_;
        local_3f8._4_4_ = -(uint)(0.0 <= auVar245._4_4_);
        local_3f8._0_4_ = -(uint)(0.0 <= auVar245._0_4_);
        fStack_3f0 = (float)-(uint)(0.0 <= auVar245._8_4_);
        fStack_3ec = (float)-(uint)(0.0 <= auVar245._12_4_);
        iVar61 = movmskps(iVar61,_local_3f8);
        if (iVar61 == 0) {
          fVar252 = 0.0;
          fVar257 = 0.0;
          fVar278 = 0.0;
          fVar279 = 0.0;
          fVar165 = 0.0;
          fVar184 = 0.0;
          fVar185 = 0.0;
          fVar186 = 0.0;
          fVar119 = 0.0;
          fVar124 = 0.0;
          fVar148 = 0.0;
          fVar163 = 0.0;
          fVar164 = 0.0;
          fVar225 = 0.0;
          fVar226 = 0.0;
          fVar232 = 0.0;
          fVar233 = 0.0;
          fVar234 = 0.0;
          fVar259 = 0.0;
          fVar267 = 0.0;
          _local_458 = ZEXT816(0);
          iVar61 = 0;
          auVar231 = _DAT_01feba00;
          auVar256 = _DAT_01feb9f0;
          fStack_4b4 = local_548;
          fStack_4b0 = fStack_544;
          fStack_4ac = fStack_540;
        }
        else {
          auVar151 = sqrtps(_local_2c8,auVar245);
          auVar140._0_4_ = fVar80 + fVar80;
          auVar140._4_4_ = fVar121 + fVar121;
          auVar140._8_4_ = fVar147 + fVar147;
          auVar140._12_4_ = fVar149 + fVar149;
          auVar82 = rcpps(auVar152,auVar140);
          fVar280 = auVar82._0_4_;
          fVar289 = auVar82._4_4_;
          fVar296 = auVar82._8_4_;
          fVar297 = auVar82._12_4_;
          fVar280 = (fVar234 - auVar140._0_4_ * fVar280) * fVar280 + fVar280;
          fVar289 = (fVar259 - auVar140._4_4_ * fVar289) * fVar289 + fVar289;
          fVar296 = (fVar257 - auVar140._8_4_ * fVar296) * fVar296 + fVar296;
          fVar297 = (fVar286 - auVar140._12_4_ * fVar297) * fVar297 + fVar297;
          fVar286 = (-(float)local_458._0_4_ - auVar151._0_4_) * fVar280;
          fVar298 = (-(float)local_458._4_4_ - auVar151._4_4_) * fVar289;
          fVar300 = (-fStack_450 - auVar151._8_4_) * fVar296;
          fVar304 = (-fStack_44c - auVar151._12_4_) * fVar297;
          fVar280 = (auVar151._0_4_ - (float)local_458._0_4_) * fVar280;
          fVar289 = (auVar151._4_4_ - (float)local_458._4_4_) * fVar289;
          fVar296 = (auVar151._8_4_ - fStack_450) * fVar296;
          fVar297 = (auVar151._12_4_ - fStack_44c) * fVar297;
          fVar252 = (fVar165 * fVar286 + (float)local_2e8._0_4_) * fVar119;
          fVar257 = (fVar184 * fVar298 + (float)local_2e8._4_4_) * fVar124;
          fVar278 = (fVar185 * fVar300 + (float)local_2e8._8_4_) * fVar148;
          fVar279 = (fVar186 * fVar304 + (float)local_2e8._12_4_) * fVar163;
          fVar164 = local_3a8 * fVar286 - ((float)local_3d8._0_4_ * fVar252 + local_5a8);
          fVar225 = fStack_3a4 * fVar298 - ((float)local_3d8._4_4_ * fVar257 + fStack_5a4);
          fVar226 = fStack_3a0 * fVar300 - (fStack_3d0 * fVar278 + fStack_5a0);
          fVar232 = fStack_39c * fVar304 - (fStack_3cc * fVar279 + fStack_59c);
          local_5b8._4_4_ = fVar225;
          local_5b8._0_4_ = fVar164;
          fStack_5b0 = fVar226;
          fStack_5ac = fVar232;
          fVar233 = local_3b8 * fVar286 - ((float)local_358._0_4_ * fVar252 + fVar250);
          fVar234 = fStack_3b4 * fVar298 - ((float)local_358._4_4_ * fVar257 + fVar268);
          fVar259 = fStack_3b0 * fVar300 - ((float)local_358._8_4_ * fVar278 + fVar258);
          fVar267 = fStack_3ac * fVar304 - ((float)local_358._12_4_ * fVar279 + fVar287);
          local_458._4_4_ = fStack_394 * fVar298 - (fVar257 * fStack_384 + fVar299);
          local_458._0_4_ = local_398 * fVar286 - (fVar252 * local_388 + fVar251);
          fStack_450 = fStack_390 * fVar300 - (fVar278 * fStack_380 + fVar269);
          fStack_44c = fStack_38c * fVar304 - (fVar279 * fStack_37c + fVar288);
          fVar119 = (fVar165 * fVar280 + (float)local_2e8._0_4_) * fVar119;
          fVar124 = (fVar184 * fVar289 + (float)local_2e8._4_4_) * fVar124;
          fVar148 = (fVar185 * fVar296 + (float)local_2e8._8_4_) * fVar148;
          fVar163 = (fVar186 * fVar297 + (float)local_2e8._12_4_) * fVar163;
          fVar252 = local_3a8 * fVar280 - ((float)local_3d8._0_4_ * fVar119 + local_5a8);
          fVar257 = fStack_3a4 * fVar289 - ((float)local_3d8._4_4_ * fVar124 + fStack_5a4);
          fVar278 = fStack_3a0 * fVar296 - (fStack_3d0 * fVar148 + fStack_5a0);
          fVar279 = fStack_39c * fVar297 - (fStack_3cc * fVar163 + fStack_59c);
          fVar165 = local_3b8 * fVar280 - ((float)local_358._0_4_ * fVar119 + fVar250);
          fVar184 = fStack_3b4 * fVar289 - ((float)local_358._4_4_ * fVar124 + fVar268);
          fVar185 = fStack_3b0 * fVar296 - ((float)local_358._8_4_ * fVar148 + fVar258);
          fVar186 = fStack_3ac * fVar297 - ((float)local_358._12_4_ * fVar163 + fVar287);
          bVar22 = 0.0 <= auVar245._0_4_;
          uVar75 = -(uint)bVar22;
          bVar74 = 0.0 <= auVar245._4_4_;
          uVar76 = -(uint)bVar74;
          bVar23 = 0.0 <= auVar245._8_4_;
          uVar77 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar245._12_4_;
          uVar78 = -(uint)bVar24;
          fVar119 = local_398 * fVar280 - (fVar119 * local_388 + fVar251);
          fVar124 = fStack_394 * fVar289 - (fVar124 * fStack_384 + fVar299);
          fVar148 = fStack_390 * fVar296 - (fVar148 * fStack_380 + fVar269);
          fVar163 = fStack_38c * fVar297 - (fVar163 * fStack_37c + fVar288);
          auVar230._0_4_ = (uint)fVar286 & uVar75;
          auVar230._4_4_ = (uint)fVar298 & uVar76;
          auVar230._8_4_ = (uint)fVar300 & uVar77;
          auVar230._12_4_ = (uint)fVar304 & uVar78;
          auVar256._0_8_ = CONCAT44(~uVar76,~uVar75) & 0x7f8000007f800000;
          auVar256._8_4_ = ~uVar77 & 0x7f800000;
          auVar256._12_4_ = ~uVar78 & 0x7f800000;
          auVar256 = auVar256 | auVar230;
          auVar174._0_4_ = (uint)fVar280 & uVar75;
          auVar174._4_4_ = (uint)fVar289 & uVar76;
          auVar174._8_4_ = (uint)fVar296 & uVar77;
          auVar174._12_4_ = (uint)fVar297 & uVar78;
          auVar231._0_8_ = CONCAT44(~uVar76,~uVar75) & 0xff800000ff800000;
          auVar231._8_4_ = ~uVar77 & 0xff800000;
          auVar231._12_4_ = ~uVar78 & 0xff800000;
          auVar231 = auVar231 | auVar174;
          auVar108._0_8_ = (ulong)local_3e8 & 0x7fffffff7fffffff;
          auVar108._8_4_ = ABS(fStack_3e0);
          auVar108._12_4_ = ABS(fStack_3dc);
          auVar38._4_4_ = fStack_294;
          auVar38._0_4_ = local_298;
          auVar38._8_4_ = fStack_290;
          auVar38._12_4_ = fStack_28c;
          auVar82 = maxps(auVar38,auVar108);
          fVar250 = auVar82._0_4_ * 1.9073486e-06;
          fVar251 = auVar82._4_4_ * 1.9073486e-06;
          fVar268 = auVar82._8_4_ * 1.9073486e-06;
          fVar299 = auVar82._12_4_ * 1.9073486e-06;
          auVar175._0_4_ = -(uint)(ABS(fVar80) < fVar250 && bVar22);
          auVar175._4_4_ = -(uint)(ABS(fVar121) < fVar251 && bVar74);
          auVar175._8_4_ = -(uint)(ABS(fVar147) < fVar268 && bVar23);
          auVar175._12_4_ = -(uint)(ABS(fVar149) < fVar299 && bVar24);
          iVar61 = movmskps(iVar61,auVar175);
          _local_538 = auVar152;
          _local_528 = auVar303;
          local_4b8 = fVar233;
          fStack_4b4 = fVar234;
          fStack_4b0 = fVar259;
          fStack_4ac = fVar267;
          if (iVar61 != 0) {
            uVar75 = -(uint)(auVar152._0_4_ <= 0.0);
            uVar76 = -(uint)(auVar152._4_4_ <= 0.0);
            uVar77 = -(uint)(auVar152._8_4_ <= 0.0);
            uVar78 = -(uint)(auVar152._12_4_ <= 0.0);
            auVar276._0_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar175._0_4_;
            auVar276._4_4_ = (uVar76 & 0xff800000 | ~uVar76 & 0x7f800000) & auVar175._4_4_;
            auVar276._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar175._8_4_;
            auVar276._12_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar175._12_4_;
            auVar266._0_4_ = ~auVar175._0_4_ & auVar256._0_4_;
            auVar266._4_4_ = ~auVar175._4_4_ & auVar256._4_4_;
            auVar266._8_4_ = ~auVar175._8_4_ & auVar256._8_4_;
            auVar266._12_4_ = ~auVar175._12_4_ & auVar256._12_4_;
            auVar256 = auVar266 | auVar276;
            auVar277._0_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar175._0_4_;
            auVar277._4_4_ = (uVar76 & 0x7f800000 | ~uVar76 & 0xff800000) & auVar175._4_4_;
            auVar277._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar175._8_4_;
            auVar277._12_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar175._12_4_;
            auVar183._0_4_ = ~auVar175._0_4_ & auVar231._0_4_;
            auVar183._4_4_ = ~auVar175._4_4_ & auVar231._4_4_;
            auVar183._8_4_ = ~auVar175._8_4_ & auVar231._8_4_;
            auVar183._12_4_ = ~auVar175._12_4_ & auVar231._12_4_;
            auVar231 = auVar183 | auVar277;
            local_3f8._4_4_ = -(uint)((fVar251 <= ABS(fVar121) || auVar152._4_4_ <= 0.0) && bVar74);
            local_3f8._0_4_ = -(uint)((fVar250 <= ABS(fVar80) || auVar152._0_4_ <= 0.0) && bVar22);
            fStack_3f0 = (float)-(uint)((fVar268 <= ABS(fVar147) || auVar152._8_4_ <= 0.0) && bVar23
                                       );
            fStack_3ec = (float)-(uint)((fVar299 <= ABS(fVar149) || auVar152._12_4_ <= 0.0) &&
                                       bVar24);
          }
        }
        fVar80 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar121 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar147 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_3d8._4_4_ =
             -(uint)(0.3 <= ABS(fVar257 * fVar80 + fVar184 * fVar121 + fVar124 * fVar147));
        local_3d8._0_4_ =
             -(uint)(0.3 <= ABS(fVar252 * fVar80 + fVar165 * fVar121 + fVar119 * fVar147));
        fStack_3d0 = (float)-(uint)(0.3 <= ABS(fVar278 * fVar80 +
                                               fVar185 * fVar121 + fVar148 * fVar147));
        fStack_3cc = (float)-(uint)(0.3 <= ABS(fVar279 * fVar80 +
                                               fVar186 * fVar121 + fVar163 * fVar147));
        _local_118 = local_378;
        local_108 = minps((undefined1  [16])local_4d8,auVar256);
        _local_1a8 = maxps(local_378,auVar231);
        local_198.m128[0] = local_4d8.x;
        local_198.m128[1] = local_4d8.y;
        local_198.m128[2] = local_4d8.z;
        local_198.m128[3] = (float)local_4d8.field_3;
        local_308._0_4_ = -(uint)(fVar203 <= local_108._0_4_) & auVar303._0_4_;
        local_308._4_4_ = -(uint)(fVar204 <= local_108._4_4_) & auVar303._4_4_;
        local_308._8_4_ = -(uint)(fVar224 <= local_108._8_4_) & auVar303._8_4_;
        local_308._12_4_ = -(uint)(fVar202 <= local_108._12_4_) & auVar303._12_4_;
        _local_3e8 = _local_1a8;
        local_318._0_8_ =
             CONCAT44(-(uint)(local_1a8._4_4_ <= local_4d8.y) & auVar303._4_4_,
                      -(uint)(local_1a8._0_4_ <= local_4d8.x) & auVar303._0_4_);
        local_318._8_4_ = -(uint)(local_1a8._8_4_ <= local_4d8.z) & auVar303._8_4_;
        local_318._12_4_ = -(uint)(local_1a8._12_4_ <= local_4d8.field_3.w) & auVar303._12_4_;
        local_2e8 = local_318;
        auVar109._8_4_ = local_318._8_4_;
        auVar109._0_8_ = local_318._0_8_;
        auVar109._12_4_ = local_318._12_4_;
        iVar61 = movmskps(iVar61,auVar109 | local_308);
        if (iVar61 != 0) {
          local_2f8 = (float)local_460;
          fStack_2f4 = (float)local_460;
          fStack_2f0 = (float)local_460;
          fStack_2ec = (float)local_460;
          local_458._0_4_ =
               -(uint)((int)(float)local_460 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_458._0_4_ * fVar147 +
                                                 fVar233 * fVar121 + fVar164 * fVar80)) &
                             local_3f8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_458._4_4_ =
               -(uint)((int)(float)local_460 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_458._4_4_ * fVar147 +
                                                 fVar234 * fVar121 + fVar225 * fVar80)) &
                             local_3f8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_450 = (float)-(uint)((int)(float)local_460 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_450 * fVar147 +
                                                                fVar259 * fVar121 + fVar226 * fVar80
                                                               )) & (uint)fStack_3f0) << 0x1f) >>
                                     0x1f) + 4);
          fStack_44c = (float)-(uint)((int)(float)local_460 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_44c * fVar147 +
                                                                fVar267 * fVar121 + fVar232 * fVar80
                                                               )) & (uint)fStack_3ec) << 0x1f) >>
                                     0x1f) + 4);
          _local_328 = local_308;
          local_308 = ~_local_458 & local_308;
          iVar61 = movmskps(iVar61,local_308);
          if (iVar61 != 0) {
            local_388 = local_368 + fVar203;
            fStack_384 = fStack_364 + fVar204;
            fStack_380 = fStack_360 + fVar224;
            fStack_37c = fStack_35c + fVar202;
            do {
              auVar151 = ~local_308 & _DAT_01feb9f0 | local_308 & local_378;
              auVar176._4_4_ = auVar151._0_4_;
              auVar176._0_4_ = auVar151._4_4_;
              auVar176._8_4_ = auVar151._12_4_;
              auVar176._12_4_ = auVar151._8_4_;
              auVar82 = minps(auVar176,auVar151);
              auVar141._0_8_ = auVar82._8_8_;
              auVar141._8_4_ = auVar82._0_4_;
              auVar141._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar141,auVar82);
              auVar142._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar151._4_4_) & local_308._4_4_,
                            -(uint)(auVar82._0_4_ == auVar151._0_4_) & local_308._0_4_);
              auVar142._8_4_ = -(uint)(auVar82._8_4_ == auVar151._8_4_) & local_308._8_4_;
              auVar142._12_4_ = -(uint)(auVar82._12_4_ == auVar151._12_4_) & local_308._12_4_;
              iVar61 = movmskps(iVar61,auVar142);
              auVar110 = local_308;
              if (iVar61 != 0) {
                auVar110._8_4_ = auVar142._8_4_;
                auVar110._0_8_ = auVar142._0_8_;
                auVar110._12_4_ = auVar142._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar110);
              pRVar65 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar65 & 1) == 0;
                    pRVar65 = (RayHit *)((long)(pRVar65->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_308 + (long)pRVar65 * 4) = 0;
              fVar164 = local_2b8[(long)pRVar65];
              fVar80 = *(float *)(local_118 + (long)pRVar65 * 4);
              pVVar1 = &(ray->super_RayK<1>).dir;
              fVar119 = (pVVar1->field_0).m128[0];
              fVar121 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
              local_4d8 = (pVVar1->field_0).field_1;
              fVar119 = fVar124 * fVar124 + fVar121 * fVar121 + fVar119 * fVar119;
              if (fVar119 < 0.0) {
                fVar119 = sqrtf(fVar119);
                pRVar65 = extraout_RAX;
              }
              else {
                fVar119 = SQRT(fVar119);
              }
              fVar148 = 0.0;
              fVar147 = 0.0;
              fVar124 = 0.0;
              auVar30._4_4_ = fStack_4a4;
              auVar30._0_4_ = local_4a8;
              auVar30._8_4_ = fStack_4a0;
              auVar30._12_4_ = fStack_49c;
              auVar34._4_4_ = fStack_434;
              auVar34._0_4_ = local_438;
              auVar34._8_4_ = fStack_430;
              auVar34._12_4_ = fStack_42c;
              auVar151 = minps(auVar30,auVar34);
              auVar264 = maxps(auVar30,auVar34);
              auVar32._4_4_ = fStack_444;
              auVar32._0_4_ = local_448;
              auVar32._8_4_ = fStack_440;
              auVar32._12_4_ = fStack_43c;
              auVar82 = minps(auVar32,_local_518);
              auVar151 = minps(auVar151,auVar82);
              auVar82 = maxps(auVar32,_local_518);
              auVar82 = maxps(auVar264,auVar82);
              auVar193._0_8_ = auVar151._0_8_ & 0x7fffffff7fffffff;
              auVar193._8_4_ = auVar151._8_4_ & 0x7fffffff;
              auVar193._12_4_ = auVar151._12_4_ & 0x7fffffff;
              local_358._4_4_ = auVar82._12_4_;
              auVar111._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar111._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar111._12_4_ = local_358._4_4_ & 0x7fffffff;
              auVar82 = maxps(auVar193,auVar111);
              fVar121 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar121 = auVar82._0_4_;
              }
              auVar194._8_8_ = auVar82._8_8_;
              auVar194._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar121) {
                auVar194._0_4_ = fVar121;
              }
              register0x00001304 = auVar194._4_12_;
              local_528._0_4_ = auVar194._0_4_ * 1.9073486e-06;
              local_348 = fVar119 * 1.9073486e-06;
              local_358._0_4_ = local_358._4_4_;
              local_358._8_4_ = local_358._4_4_;
              local_358._12_4_ = local_358._4_4_;
              lVar73 = 4;
              do {
                fVar185 = 1.0 - fVar164;
                _local_5b8 = ZEXT416((uint)fVar185);
                fVar121 = fVar164 * fVar164;
                fVar119 = fVar164 * 3.0;
                local_578 = fVar119 + -5.0;
                _local_588 = ZEXT416((uint)(fVar185 * fVar185));
                fVar184 = -fVar164 * fVar185 * fVar185 * 0.5;
                fVar149 = (fVar121 * local_578 + 2.0) * 0.5;
                fVar163 = ((fVar185 * 3.0 + -5.0) * fVar185 * fVar185 + 2.0) * 0.5;
                fVar165 = -fVar185 * fVar164 * fVar164 * 0.5;
                local_4b8 = fVar184 * local_4a8 +
                            fVar149 * local_438 +
                            fVar163 * local_448 + fVar165 * (float)local_518._0_4_;
                fStack_4b4 = fVar184 * fStack_4a4 +
                             fVar149 * fStack_434 +
                             fVar163 * fStack_444 + fVar165 * (float)local_518._4_4_;
                fStack_4b0 = fVar184 * fStack_4a0 +
                             fVar149 * fStack_430 + fVar163 * fStack_440 + fVar165 * fStack_510;
                fStack_4ac = fVar184 * fStack_49c +
                             fVar149 * fStack_42c + fVar163 * fStack_43c + fVar165 * fStack_50c;
                _local_598 = ZEXT416((uint)(fVar185 * -2.0));
                local_568 = fVar164 * -9.0 + 4.0;
                local_548 = fVar119 + -1.0;
                local_538._0_4_ = (fVar80 * local_4d8.x + 0.0) - local_4b8;
                local_538._4_4_ = (fVar80 * local_4d8.y + 0.0) - fStack_4b4;
                fStack_530 = (fVar80 * local_4d8.z + 0.0) - fStack_4b0;
                fStack_52c = (fVar80 * local_4d8.field_3.w + 0.0) - fStack_4ac;
                fVar149 = (float)local_538._4_4_ * (float)local_538._4_4_;
                fStack_5a0 = fStack_530 * fStack_530;
                fStack_59c = fStack_52c * fStack_52c;
                local_5a8 = fVar149 + (float)local_538._0_4_ * (float)local_538._0_4_ + fStack_5a0;
                fStack_5a4 = fVar149 + fVar149 + fStack_59c;
                fStack_5a0 = fVar149 + fStack_5a0 + fStack_5a0;
                fStack_59c = fVar149 + fStack_59c + fStack_59c;
                local_338 = local_5a8;
                fStack_574 = fVar124;
                fStack_570 = fVar147;
                fStack_56c = fVar148;
                fStack_564 = fVar124;
                fStack_560 = fVar147;
                fStack_55c = fVar148;
                if (local_5a8 < 0.0) {
                  _local_508 = ZEXT416((uint)(fVar164 * 9.0));
                  fStack_544 = fVar124;
                  fStack_540 = fVar147;
                  fStack_53c = fVar148;
                  local_4f8 = fVar121;
                  fStack_4f4 = fVar124;
                  fStack_4f0 = fVar147;
                  fStack_4ec = fVar148;
                  local_4e8 = fVar119;
                  fStack_4e4 = fVar124;
                  fStack_4e0 = fVar147;
                  fStack_4dc = fVar148;
                  fVar163 = sqrtf(local_5a8);
                  pRVar66 = extraout_RAX_00;
                  fVar149 = (float)local_508._0_4_;
                  fVar119 = local_4e8;
                  fVar121 = local_4f8;
                }
                else {
                  fVar163 = SQRT(local_5a8);
                  pRVar66 = pRVar65;
                  fVar149 = fVar164 * 9.0;
                }
                fVar184 = (fVar164 * ((float)local_5b8._0_4_ + (float)local_5b8._0_4_) -
                          (float)local_588._0_4_) * 0.5;
                fVar165 = ((fVar164 + fVar164) * local_578 + fVar164 * fVar119) * 0.5;
                fVar185 = ((fVar119 + 2.0) * ((float)local_5b8._0_4_ + (float)local_5b8._0_4_) +
                          (float)local_5b8._0_4_ * -3.0 * (float)local_5b8._0_4_) * 0.5;
                fVar119 = ((float)local_598._0_4_ * fVar164 + fVar121) * 0.5;
                local_5b8._0_4_ =
                     fVar184 * local_4a8 +
                     fVar165 * local_438 + fVar185 * local_448 + fVar119 * (float)local_518._0_4_;
                local_5b8._4_4_ =
                     fVar184 * fStack_4a4 +
                     fVar165 * fStack_434 + fVar185 * fStack_444 + fVar119 * (float)local_518._4_4_;
                fStack_5b0 = fVar184 * fStack_4a0 +
                             fVar165 * fStack_430 + fVar185 * fStack_440 + fVar119 * fStack_510;
                fStack_5ac = fVar184 * fStack_49c +
                             fVar165 * fStack_42c + fVar185 * fStack_43c + fVar119 * fStack_50c;
                fVar119 = fVar164 * -3.0 + 2.0;
                fVar149 = fVar149 + -5.0;
                fVar185 = local_548 * fStack_50c;
                fVar121 = fVar119 * local_4a8 +
                          fVar149 * local_438 +
                          local_568 * local_448 + local_548 * (float)local_518._0_4_;
                fVar165 = fVar119 * fStack_4a4 +
                          fVar149 * fStack_434 +
                          local_568 * fStack_444 + local_548 * (float)local_518._4_4_;
                fVar184 = fVar119 * fStack_4a0 +
                          fVar149 * fStack_430 + local_568 * fStack_440 + local_548 * fStack_510;
                local_548 = (float)local_528._0_4_;
                if ((float)local_528._0_4_ <= local_348 * fVar80) {
                  local_548 = local_348 * fVar80;
                }
                fVar186 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_ +
                          (float)local_5b8._0_4_ * (float)local_5b8._0_4_ + fStack_5b0 * fStack_5b0;
                auVar151 = ZEXT416((uint)fVar186);
                auVar82 = rsqrtss(ZEXT416((uint)fVar186),auVar151);
                fVar202 = auVar82._0_4_;
                fVar203 = fVar202 * fVar202 * fVar186 * -0.5 * fVar202 + fVar202 * 1.5;
                fVar202 = fVar184 * fStack_5b0 +
                          fVar165 * (float)local_5b8._4_4_ + fVar121 * (float)local_5b8._0_4_;
                auVar82 = rcpss(auVar151,auVar151);
                fVar204 = (2.0 - fVar186 * auVar82._0_4_) * auVar82._0_4_;
                local_598._0_4_ =
                     fVar204 * (fVar186 * fVar121 - fVar202 * (float)local_5b8._0_4_) * fVar203;
                local_598._4_4_ =
                     fVar204 * (fVar186 * fVar165 - fVar202 * (float)local_5b8._4_4_) * fVar203;
                fStack_590 = fVar204 * (fVar186 * fVar184 - fVar202 * fStack_5b0) * fVar203;
                fStack_544 = (float)local_528._4_4_;
                fStack_540 = fStack_520;
                fStack_53c = (float)uStack_51c;
                if (fVar186 < 0.0) {
                  local_588._4_4_ = (float)local_5b8._4_4_ * fVar203;
                  local_588._0_4_ = (float)local_5b8._0_4_ * fVar203;
                  fStack_580 = fStack_5b0 * fVar203;
                  fStack_57c = fStack_5ac * fVar203;
                  fStack_58c = fVar204 * (fVar186 * (fVar119 * fStack_49c +
                                                    fVar149 * fStack_42c +
                                                    local_568 * fStack_43c + fVar185) -
                                         fVar202 * fStack_5ac) * fVar203;
                  local_578 = -(float)local_5b8._0_4_;
                  fStack_574 = -(float)local_5b8._4_4_;
                  fStack_570 = -fStack_5b0;
                  fStack_56c = -fStack_5ac;
                  local_568 = fVar163;
                  fVar186 = sqrtf(fVar186);
                  pRVar66 = extraout_RAX_01;
                  fVar119 = local_578;
                  fVar121 = fStack_574;
                  fVar149 = fStack_570;
                  fVar165 = fStack_56c;
                  fVar163 = local_568;
                  fVar184 = (float)local_588._0_4_;
                  fVar185 = (float)local_588._4_4_;
                  fVar202 = fStack_580;
                  fVar203 = fStack_57c;
                }
                else {
                  fVar186 = SQRT(fVar186);
                  fVar119 = -(float)local_5b8._0_4_;
                  fVar121 = -(float)local_5b8._4_4_;
                  fVar149 = -fStack_5b0;
                  fVar165 = -fStack_5ac;
                  fVar184 = (float)local_5b8._0_4_ * fVar203;
                  fVar185 = (float)local_5b8._4_4_ * fVar203;
                  fVar202 = fStack_5b0 * fVar203;
                  fVar203 = fStack_5ac * fVar203;
                }
                fVar204 = (float)local_538._4_4_ * fVar185;
                fVar225 = fStack_530 * fVar202;
                fVar226 = fStack_52c * fVar203;
                fVar224 = fVar204 + (float)local_538._0_4_ * fVar184 + fVar225;
                fVar232 = fVar204 + fVar204 + fVar226;
                fVar225 = fVar204 + fVar225 + fVar225;
                fVar226 = fVar204 + fVar226 + fVar226;
                fVar163 = (fVar163 + 1.0) * ((float)local_528._0_4_ / fVar186) +
                          fVar163 * (float)local_528._0_4_ + local_548;
                fVar204 = fVar203 * fVar165;
                fVar186 = fVar202 * fVar149 + fVar185 * fVar121 + fVar184 * fVar119 +
                          fStack_590 * fStack_530 +
                          (float)local_598._4_4_ * (float)local_538._4_4_ +
                          (float)local_598._0_4_ * (float)local_538._0_4_;
                local_598._0_4_ =
                     local_4d8.z * fVar202 + local_4d8.y * fVar185 + local_4d8.x * fVar184;
                auVar195._4_4_ = fStack_5a4;
                auVar195._0_4_ = local_5a8;
                auVar195._8_4_ = fStack_5a0;
                auVar195._12_4_ = fStack_59c;
                fVar184 = local_5a8 - fVar224 * fVar224;
                auVar112._0_8_ = CONCAT44(fStack_5a4 - fVar232 * fVar232,fVar184);
                auVar112._8_4_ = fStack_5a0 - fVar225 * fVar225;
                auVar112._12_4_ = fStack_59c - fVar226 * fVar226;
                fVar165 = fVar165 * fStack_52c;
                fVar119 = (fVar149 * fStack_530 +
                          fVar121 * (float)local_538._4_4_ + fVar119 * (float)local_538._0_4_) -
                          fVar224 * fVar186;
                fStack_4e0 = local_4d8.z * fStack_530;
                fStack_4e4 = local_4d8.field_3.w * fStack_52c;
                local_598._4_4_ = local_4d8.field_3.w * fVar203;
                fStack_590 = local_4d8.z * fVar202;
                fStack_58c = local_4d8.field_3.w * fVar203;
                local_4e8 = (fStack_4e0 +
                            local_4d8.y * (float)local_538._4_4_ +
                            local_4d8.x * (float)local_538._0_4_) - fVar224 * (float)local_598._0_4_
                ;
                auVar177._8_4_ = auVar112._8_4_;
                auVar177._0_8_ = auVar112._0_8_;
                auVar177._12_4_ = auVar112._12_4_;
                auVar82 = rsqrtss(auVar177,auVar112);
                fVar121 = auVar82._0_4_;
                auVar178._4_12_ = auVar82._4_12_;
                auVar178._0_4_ = fVar121 * fVar121 * fVar184 * -0.5 * fVar121 + fVar121 * 1.5;
                fStack_4dc = fStack_4e4;
                if (fVar184 < 0.0) {
                  local_588._4_4_ = fVar204;
                  local_588._0_4_ = fVar186;
                  fStack_580 = fVar202 * fVar149;
                  fStack_57c = fVar204;
                  local_578 = fVar119;
                  fStack_574 = fVar165;
                  fStack_570 = fVar149 * fStack_530;
                  fStack_56c = fVar165;
                  local_568 = fVar163;
                  _local_508 = auVar178;
                  local_4f8 = fVar224;
                  fStack_4f4 = fVar232;
                  fStack_4f0 = fVar225;
                  fStack_4ec = fVar226;
                  fVar184 = sqrtf(fVar184);
                  auVar195._4_4_ = fStack_5a4;
                  auVar195._0_4_ = local_5a8;
                  auVar195._8_4_ = fStack_5a0;
                  auVar195._12_4_ = fStack_59c;
                  pRVar66 = extraout_RAX_02;
                  auVar178 = _local_508;
                  fVar119 = local_578;
                  fVar165 = fStack_574;
                  fVar163 = local_568;
                  fVar186 = (float)local_588._0_4_;
                  fVar204 = (float)local_588._4_4_;
                  fVar224 = local_4f8;
                }
                else {
                  fVar184 = SQRT(fVar184);
                }
                fVar184 = fVar184 - fStack_4ac;
                fVar119 = fVar119 * auVar178._0_4_ - fStack_5ac;
                auVar28._4_4_ = fStack_4e4;
                auVar28._0_4_ = local_4e8;
                auVar28._8_4_ = fStack_4e0;
                auVar28._12_4_ = fStack_4dc;
                auVar153._4_12_ = auVar28._4_12_;
                auVar153._0_4_ = local_4e8 * auVar178._0_4_;
                auVar247._0_8_ = CONCAT44(fVar165,fVar119) ^ 0x8000000080000000;
                auVar247._8_4_ = -fVar165;
                auVar247._12_4_ = fVar204;
                auVar246._8_8_ = auVar247._8_8_;
                auVar246._0_8_ = CONCAT44(fVar186,fVar119) ^ 0x80000000;
                auVar310._0_4_ = fVar186 * auVar153._0_4_ - (float)local_598._0_4_ * fVar119;
                auVar155._0_8_ = auVar153._0_8_;
                auVar155._8_4_ = fStack_4e4;
                auVar155._12_4_ = local_598._4_4_ ^ 0x80000000;
                auVar154._8_8_ = auVar155._8_8_;
                auVar154._0_8_ = CONCAT44(local_598._0_4_,auVar153._0_4_) ^ 0x8000000000000000;
                auVar310._4_4_ = auVar310._0_4_;
                auVar310._8_4_ = auVar310._0_4_;
                auVar310._12_4_ = auVar310._0_4_;
                auVar82 = divps(auVar154,auVar310);
                auVar151 = divps(auVar246,auVar310);
                fVar164 = fVar164 - (auVar82._4_4_ * fVar184 + auVar82._0_4_ * fVar224);
                fVar80 = fVar80 - (auVar151._4_4_ * fVar184 + auVar151._0_4_ * fVar224);
                if ((fVar163 <= ABS(fVar224)) ||
                   ((float)local_358._0_4_ * 1.9073486e-06 + local_548 + fVar163 <= ABS(fVar184))) {
                  bVar22 = false;
                }
                else {
                  fVar80 = fVar80 + (float)local_2d8._0_4_;
                  bVar22 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar80) &&
                       (fVar119 = (ray->super_RayK<1>).tfar, fVar80 <= fVar119)) && (0.0 <= fVar164)
                      ) && (fVar164 <= 1.0)) {
                    auVar82 = rsqrtss(auVar195,auVar195);
                    fVar121 = auVar82._0_4_;
                    pGVar18 = (context->scene->geometries).items[(long)local_550].ptr;
                    uVar75 = (ray->super_RayK<1>).mask;
                    pRVar66 = (RayHit *)(ulong)uVar75;
                    pRVar68 = local_550;
                    if ((pGVar18->mask & uVar75) != 0) {
                      fVar121 = fVar121 * 1.5 + fVar121 * fVar121 * local_338 * -0.5 * fVar121;
                      fVar184 = (float)local_538._0_4_ * fVar121;
                      fVar186 = (float)local_538._4_4_ * fVar121;
                      fVar121 = fStack_530 * fVar121;
                      fVar163 = fStack_5ac * fVar184 + (float)local_5b8._0_4_;
                      fVar149 = fStack_5ac * fVar186 + (float)local_5b8._4_4_;
                      fVar165 = fStack_5ac * fVar121 + fStack_5b0;
                      fVar185 = fVar186 * (float)local_5b8._0_4_ - (float)local_5b8._4_4_ * fVar184;
                      fVar186 = fVar121 * (float)local_5b8._4_4_ - fStack_5b0 * fVar186;
                      fVar184 = fVar184 * fStack_5b0 - (float)local_5b8._0_4_ * fVar121;
                      fVar121 = fVar149 * fVar186 - fVar184 * fVar163;
                      fVar149 = fVar165 * fVar184 - fVar185 * fVar149;
                      fVar163 = fVar163 * fVar185 - fVar186 * fVar165;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar80;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar163,fVar149);
                        (ray->Ng).field_0.field_0.z = fVar121;
                        ray->u = fVar164;
                        ray->v = 0.0;
                        ray->primID = (uint)local_4c0;
                        ray->geomID = (uint)local_550;
                        ray->instID[0] = context->user->instID[0];
                        uVar75 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar75;
                        pRVar66 = (RayHit *)(ulong)uVar75;
                      }
                      else {
                        local_428 = CONCAT44(fVar163,fVar149);
                        fStack_420 = fVar121;
                        fStack_41c = fVar164;
                        local_418 = 0;
                        local_414 = (uint)local_4c0;
                        local_410 = (uint)local_550;
                        local_40c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_40c;
                        local_408 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar80;
                        local_5bc = 0xffffffff;
                        local_498.geometryUserPtr = pGVar18->userPtr;
                        local_498.valid = &local_5bc;
                        local_498.context = context->user;
                        local_498.hit = (RTCHitN *)&local_428;
                        local_498.N = 1;
                        local_5a8 = fVar119;
                        local_498.ray = (RTCRayN *)ray;
                        if (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c1c7a9:
                          pRVar68 = context->args;
                          if (pRVar68->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar18->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar68->filter)(&local_498);
                            }
                            if ((((RayK<1> *)local_498.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00c1c85a;
                          }
                          (((Vec3f *)((long)local_498.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_498.hit;
                          (((Vec3f *)((long)local_498.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_498.hit + 4);
                          (((Vec3f *)((long)local_498.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_498.hit + 8);
                          *(float *)((long)local_498.ray + 0x3c) = *(float *)(local_498.hit + 0xc);
                          *(float *)((long)local_498.ray + 0x40) = *(float *)(local_498.hit + 0x10);
                          *(float *)((long)local_498.ray + 0x44) = *(float *)(local_498.hit + 0x14);
                          *(float *)((long)local_498.ray + 0x48) = *(float *)(local_498.hit + 0x18);
                          *(float *)((long)local_498.ray + 0x4c) = *(float *)(local_498.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_498.hit + 0x20);
                          *(float *)((long)local_498.ray + 0x50) = *(float *)(local_498.hit + 0x20);
                          pRVar66 = (RayHit *)local_498.ray;
                        }
                        else {
                          (*pGVar18->intersectionFilterN)(&local_498);
                          if ((((RayK<1> *)local_498.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00c1c7a9;
LAB_00c1c85a:
                          (ray->super_RayK<1>).tfar = local_5a8;
                          pRVar66 = (RayHit *)local_498.valid;
                        }
                      }
                    }
                  }
                }
                bVar74 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                pRVar65 = (RayHit *)CONCAT71((int7)((ulong)pRVar66 >> 8),bVar74);
              } while ((!bVar22) && (!bVar74));
              fVar164 = (ray->super_RayK<1>).tfar;
              local_308._0_4_ = -(uint)(local_388 <= fVar164) & local_308._0_4_;
              local_308._4_4_ = -(uint)(fStack_384 <= fVar164) & local_308._4_4_;
              local_308._8_4_ = -(uint)(fStack_380 <= fVar164) & local_308._8_4_;
              local_308._12_4_ = -(uint)(fStack_37c <= fVar164) & local_308._12_4_;
              uVar67 = (undefined4)((ulong)pRVar66 >> 0x20);
              iVar61 = movmskps((int)pRVar65,local_308);
            } while (iVar61 != 0);
          }
          fVar164 = (ray->super_RayK<1>).tfar;
          local_3e8._0_4_ = -(uint)((float)local_3e8._0_4_ + local_368 <= fVar164) & local_2e8._0_4_
          ;
          local_3e8._4_4_ =
               -(uint)((float)local_3e8._4_4_ + fStack_364 <= fVar164) & local_2e8._4_4_;
          fStack_3e0 = (float)(-(uint)(fStack_3e0 + fStack_360 <= fVar164) & local_2e8._8_4_);
          fStack_3dc = (float)(-(uint)(fStack_3dc + fStack_35c <= fVar164) & local_2e8._12_4_);
          local_3d8._0_4_ =
               -(uint)((int)local_2f8 <
                      ((int)((local_3d8._0_4_ & local_3f8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_3d8._4_4_ =
               -(uint)((int)fStack_2f4 <
                      ((int)((local_3d8._4_4_ & local_3f8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_3d0 = (float)-(uint)((int)fStack_2f0 <
                                     ((int)(((uint)fStack_3d0 & (uint)fStack_3f0) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_3cc = (float)-(uint)((int)fStack_2ec <
                                     ((int)(((uint)fStack_3cc & (uint)fStack_3ec) << 0x1f) >> 0x1f)
                                     + 4);
          local_318 = ~_local_3d8 & _local_3e8;
          iVar61 = movmskps(iVar61,local_318);
          if (iVar61 != 0) {
            local_378 = _local_1a8;
            local_388 = local_368 + (float)local_1a8._0_4_;
            fStack_384 = fStack_364 + (float)local_1a8._4_4_;
            fStack_380 = fStack_360 + fStack_1a0;
            fStack_37c = fStack_35c + fStack_19c;
            do {
              auVar151 = ~local_318 & _DAT_01feb9f0 | local_318 & local_378;
              auVar179._4_4_ = auVar151._0_4_;
              auVar179._0_4_ = auVar151._4_4_;
              auVar179._8_4_ = auVar151._12_4_;
              auVar179._12_4_ = auVar151._8_4_;
              auVar82 = minps(auVar179,auVar151);
              auVar143._0_8_ = auVar82._8_8_;
              auVar143._8_4_ = auVar82._0_4_;
              auVar143._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar143,auVar82);
              auVar144._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar151._4_4_) & local_318._4_4_,
                            -(uint)(auVar82._0_4_ == auVar151._0_4_) & local_318._0_4_);
              auVar144._8_4_ = -(uint)(auVar82._8_4_ == auVar151._8_4_) & local_318._8_4_;
              auVar144._12_4_ = -(uint)(auVar82._12_4_ == auVar151._12_4_) & local_318._12_4_;
              iVar61 = movmskps(iVar61,auVar144);
              auVar113 = local_318;
              if (iVar61 != 0) {
                auVar113._8_4_ = auVar144._8_4_;
                auVar113._0_8_ = auVar144._0_8_;
                auVar113._12_4_ = auVar144._12_4_;
              }
              uVar62 = movmskps(iVar61,auVar113);
              pRVar65 = (RayHit *)0x0;
              if (CONCAT44(uVar67,uVar62) != 0) {
                for (; (CONCAT44(uVar67,uVar62) >> (long)pRVar65 & 1) == 0;
                    pRVar65 = (RayHit *)((long)(pRVar65->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_318 + (long)pRVar65 * 4) = 0;
              fVar164 = local_2b8[(long)&pRVar65[-1].field_0x5c];
              fVar80 = *(float *)((long)&local_198 + (long)pRVar65 * 4);
              pVVar1 = &(ray->super_RayK<1>).dir;
              fVar119 = (pVVar1->field_0).m128[0];
              fVar121 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
              local_4d8 = (pVVar1->field_0).field_1;
              fVar119 = fVar124 * fVar124 + fVar121 * fVar121 + fVar119 * fVar119;
              if (fVar119 < 0.0) {
                fVar119 = sqrtf(fVar119);
                pRVar65 = extraout_RAX_03;
              }
              else {
                fVar119 = SQRT(fVar119);
              }
              fVar148 = 0.0;
              fVar147 = 0.0;
              fVar124 = 0.0;
              auVar31._4_4_ = fStack_4a4;
              auVar31._0_4_ = local_4a8;
              auVar31._8_4_ = fStack_4a0;
              auVar31._12_4_ = fStack_49c;
              auVar35._4_4_ = fStack_434;
              auVar35._0_4_ = local_438;
              auVar35._8_4_ = fStack_430;
              auVar35._12_4_ = fStack_42c;
              auVar151 = minps(auVar31,auVar35);
              auVar264 = maxps(auVar31,auVar35);
              auVar33._4_4_ = fStack_444;
              auVar33._0_4_ = local_448;
              auVar33._8_4_ = fStack_440;
              auVar33._12_4_ = fStack_43c;
              auVar82 = minps(auVar33,_local_518);
              auVar151 = minps(auVar151,auVar82);
              auVar82 = maxps(auVar33,_local_518);
              auVar82 = maxps(auVar264,auVar82);
              auVar196._0_8_ = auVar151._0_8_ & 0x7fffffff7fffffff;
              auVar196._8_4_ = auVar151._8_4_ & 0x7fffffff;
              auVar196._12_4_ = auVar151._12_4_ & 0x7fffffff;
              local_358._4_4_ = auVar82._12_4_;
              auVar114._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar114._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar114._12_4_ = local_358._4_4_ & 0x7fffffff;
              auVar82 = maxps(auVar196,auVar114);
              fVar121 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar121 = auVar82._0_4_;
              }
              auVar197._8_8_ = auVar82._8_8_;
              auVar197._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar121) {
                auVar197._0_4_ = fVar121;
              }
              register0x00001304 = auVar197._4_12_;
              local_528._0_4_ = auVar197._0_4_ * 1.9073486e-06;
              local_348 = fVar119 * 1.9073486e-06;
              local_358._0_4_ = local_358._4_4_;
              local_358._8_4_ = local_358._4_4_;
              local_358._12_4_ = local_358._4_4_;
              lVar73 = 4;
              do {
                fVar185 = 1.0 - fVar164;
                _local_5b8 = ZEXT416((uint)fVar185);
                fVar121 = fVar164 * fVar164;
                fVar119 = fVar164 * 3.0;
                local_578 = fVar119 + -5.0;
                _local_588 = ZEXT416((uint)(fVar185 * fVar185));
                fVar184 = -fVar164 * fVar185 * fVar185 * 0.5;
                fVar149 = (fVar121 * local_578 + 2.0) * 0.5;
                fVar163 = ((fVar185 * 3.0 + -5.0) * fVar185 * fVar185 + 2.0) * 0.5;
                fVar165 = -fVar185 * fVar164 * fVar164 * 0.5;
                local_4b8 = fVar184 * local_4a8 +
                            fVar149 * local_438 +
                            fVar163 * local_448 + fVar165 * (float)local_518._0_4_;
                fStack_4b4 = fVar184 * fStack_4a4 +
                             fVar149 * fStack_434 +
                             fVar163 * fStack_444 + fVar165 * (float)local_518._4_4_;
                fStack_4b0 = fVar184 * fStack_4a0 +
                             fVar149 * fStack_430 + fVar163 * fStack_440 + fVar165 * fStack_510;
                fStack_4ac = fVar184 * fStack_49c +
                             fVar149 * fStack_42c + fVar163 * fStack_43c + fVar165 * fStack_50c;
                _local_598 = ZEXT416((uint)(fVar185 * -2.0));
                local_568 = fVar164 * -9.0 + 4.0;
                local_548 = fVar119 + -1.0;
                local_538._0_4_ = (fVar80 * local_4d8.x + 0.0) - local_4b8;
                local_538._4_4_ = (fVar80 * local_4d8.y + 0.0) - fStack_4b4;
                fStack_530 = (fVar80 * local_4d8.z + 0.0) - fStack_4b0;
                fStack_52c = (fVar80 * local_4d8.field_3.w + 0.0) - fStack_4ac;
                fVar149 = (float)local_538._4_4_ * (float)local_538._4_4_;
                fStack_5a0 = fStack_530 * fStack_530;
                fStack_59c = fStack_52c * fStack_52c;
                local_5a8 = fVar149 + (float)local_538._0_4_ * (float)local_538._0_4_ + fStack_5a0;
                fStack_5a4 = fVar149 + fVar149 + fStack_59c;
                fStack_5a0 = fVar149 + fStack_5a0 + fStack_5a0;
                fStack_59c = fVar149 + fStack_59c + fStack_59c;
                local_338 = local_5a8;
                fStack_574 = fVar124;
                fStack_570 = fVar147;
                fStack_56c = fVar148;
                fStack_564 = fVar124;
                fStack_560 = fVar147;
                fStack_55c = fVar148;
                if (local_5a8 < 0.0) {
                  _local_508 = ZEXT416((uint)(fVar164 * 9.0));
                  fStack_544 = fVar124;
                  fStack_540 = fVar147;
                  fStack_53c = fVar148;
                  local_4f8 = fVar121;
                  fStack_4f4 = fVar124;
                  fStack_4f0 = fVar147;
                  fStack_4ec = fVar148;
                  local_4e8 = fVar119;
                  fStack_4e4 = fVar124;
                  fStack_4e0 = fVar147;
                  fStack_4dc = fVar148;
                  fVar163 = sqrtf(local_5a8);
                  pRVar66 = extraout_RAX_04;
                  fVar149 = (float)local_508._0_4_;
                  fVar119 = local_4e8;
                  fVar121 = local_4f8;
                }
                else {
                  fVar163 = SQRT(local_5a8);
                  pRVar66 = pRVar65;
                  fVar149 = fVar164 * 9.0;
                }
                fVar184 = (fVar164 * ((float)local_5b8._0_4_ + (float)local_5b8._0_4_) -
                          (float)local_588._0_4_) * 0.5;
                fVar165 = ((fVar164 + fVar164) * local_578 + fVar164 * fVar119) * 0.5;
                fVar185 = ((fVar119 + 2.0) * ((float)local_5b8._0_4_ + (float)local_5b8._0_4_) +
                          (float)local_5b8._0_4_ * -3.0 * (float)local_5b8._0_4_) * 0.5;
                fVar119 = ((float)local_598._0_4_ * fVar164 + fVar121) * 0.5;
                local_5b8._0_4_ =
                     fVar184 * local_4a8 +
                     fVar165 * local_438 + fVar185 * local_448 + fVar119 * (float)local_518._0_4_;
                local_5b8._4_4_ =
                     fVar184 * fStack_4a4 +
                     fVar165 * fStack_434 + fVar185 * fStack_444 + fVar119 * (float)local_518._4_4_;
                fStack_5b0 = fVar184 * fStack_4a0 +
                             fVar165 * fStack_430 + fVar185 * fStack_440 + fVar119 * fStack_510;
                fStack_5ac = fVar184 * fStack_49c +
                             fVar165 * fStack_42c + fVar185 * fStack_43c + fVar119 * fStack_50c;
                fVar119 = fVar164 * -3.0 + 2.0;
                fVar149 = fVar149 + -5.0;
                fVar185 = local_548 * fStack_50c;
                fVar121 = fVar119 * local_4a8 +
                          fVar149 * local_438 +
                          local_568 * local_448 + local_548 * (float)local_518._0_4_;
                fVar165 = fVar119 * fStack_4a4 +
                          fVar149 * fStack_434 +
                          local_568 * fStack_444 + local_548 * (float)local_518._4_4_;
                fVar184 = fVar119 * fStack_4a0 +
                          fVar149 * fStack_430 + local_568 * fStack_440 + local_548 * fStack_510;
                local_548 = (float)local_528._0_4_;
                if ((float)local_528._0_4_ <= local_348 * fVar80) {
                  local_548 = local_348 * fVar80;
                }
                fVar186 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_ +
                          (float)local_5b8._0_4_ * (float)local_5b8._0_4_ + fStack_5b0 * fStack_5b0;
                auVar151 = ZEXT416((uint)fVar186);
                auVar82 = rsqrtss(ZEXT416((uint)fVar186),auVar151);
                fVar202 = auVar82._0_4_;
                fVar203 = fVar202 * fVar202 * fVar186 * -0.5 * fVar202 + fVar202 * 1.5;
                fVar202 = fVar184 * fStack_5b0 +
                          fVar165 * (float)local_5b8._4_4_ + fVar121 * (float)local_5b8._0_4_;
                auVar82 = rcpss(auVar151,auVar151);
                fVar204 = (2.0 - fVar186 * auVar82._0_4_) * auVar82._0_4_;
                local_598._0_4_ =
                     fVar204 * (fVar186 * fVar121 - fVar202 * (float)local_5b8._0_4_) * fVar203;
                local_598._4_4_ =
                     fVar204 * (fVar186 * fVar165 - fVar202 * (float)local_5b8._4_4_) * fVar203;
                fStack_590 = fVar204 * (fVar186 * fVar184 - fVar202 * fStack_5b0) * fVar203;
                fStack_544 = (float)local_528._4_4_;
                fStack_540 = fStack_520;
                fStack_53c = (float)uStack_51c;
                if (fVar186 < 0.0) {
                  local_588._4_4_ = (float)local_5b8._4_4_ * fVar203;
                  local_588._0_4_ = (float)local_5b8._0_4_ * fVar203;
                  fStack_580 = fStack_5b0 * fVar203;
                  fStack_57c = fStack_5ac * fVar203;
                  fStack_58c = fVar204 * (fVar186 * (fVar119 * fStack_49c +
                                                    fVar149 * fStack_42c +
                                                    local_568 * fStack_43c + fVar185) -
                                         fVar202 * fStack_5ac) * fVar203;
                  local_578 = -(float)local_5b8._0_4_;
                  fStack_574 = -(float)local_5b8._4_4_;
                  fStack_570 = -fStack_5b0;
                  fStack_56c = -fStack_5ac;
                  local_568 = fVar163;
                  fVar186 = sqrtf(fVar186);
                  pRVar66 = extraout_RAX_05;
                  fVar119 = local_578;
                  fVar121 = fStack_574;
                  fVar149 = fStack_570;
                  fVar165 = fStack_56c;
                  fVar163 = local_568;
                  fVar184 = (float)local_588._0_4_;
                  fVar185 = (float)local_588._4_4_;
                  fVar202 = fStack_580;
                  fVar203 = fStack_57c;
                }
                else {
                  fVar186 = SQRT(fVar186);
                  fVar119 = -(float)local_5b8._0_4_;
                  fVar121 = -(float)local_5b8._4_4_;
                  fVar149 = -fStack_5b0;
                  fVar165 = -fStack_5ac;
                  fVar184 = (float)local_5b8._0_4_ * fVar203;
                  fVar185 = (float)local_5b8._4_4_ * fVar203;
                  fVar202 = fStack_5b0 * fVar203;
                  fVar203 = fStack_5ac * fVar203;
                }
                fVar204 = (float)local_538._4_4_ * fVar185;
                fVar225 = fStack_530 * fVar202;
                fVar226 = fStack_52c * fVar203;
                fVar224 = fVar204 + (float)local_538._0_4_ * fVar184 + fVar225;
                fVar232 = fVar204 + fVar204 + fVar226;
                fVar225 = fVar204 + fVar225 + fVar225;
                fVar226 = fVar204 + fVar226 + fVar226;
                fVar163 = (fVar163 + 1.0) * ((float)local_528._0_4_ / fVar186) +
                          fVar163 * (float)local_528._0_4_ + local_548;
                fVar204 = fVar203 * fVar165;
                fVar186 = fVar202 * fVar149 + fVar185 * fVar121 + fVar184 * fVar119 +
                          fStack_590 * fStack_530 +
                          (float)local_598._4_4_ * (float)local_538._4_4_ +
                          (float)local_598._0_4_ * (float)local_538._0_4_;
                local_598._0_4_ =
                     local_4d8.z * fVar202 + local_4d8.y * fVar185 + local_4d8.x * fVar184;
                auVar198._4_4_ = fStack_5a4;
                auVar198._0_4_ = local_5a8;
                auVar198._8_4_ = fStack_5a0;
                auVar198._12_4_ = fStack_59c;
                fVar184 = local_5a8 - fVar224 * fVar224;
                auVar115._0_8_ = CONCAT44(fStack_5a4 - fVar232 * fVar232,fVar184);
                auVar115._8_4_ = fStack_5a0 - fVar225 * fVar225;
                auVar115._12_4_ = fStack_59c - fVar226 * fVar226;
                fVar165 = fVar165 * fStack_52c;
                fVar119 = (fVar149 * fStack_530 +
                          fVar121 * (float)local_538._4_4_ + fVar119 * (float)local_538._0_4_) -
                          fVar224 * fVar186;
                fStack_4e0 = local_4d8.z * fStack_530;
                fStack_4e4 = local_4d8.field_3.w * fStack_52c;
                local_598._4_4_ = local_4d8.field_3.w * fVar203;
                fStack_590 = local_4d8.z * fVar202;
                fStack_58c = local_4d8.field_3.w * fVar203;
                local_4e8 = (fStack_4e0 +
                            local_4d8.y * (float)local_538._4_4_ +
                            local_4d8.x * (float)local_538._0_4_) - fVar224 * (float)local_598._0_4_
                ;
                auVar180._8_4_ = auVar115._8_4_;
                auVar180._0_8_ = auVar115._0_8_;
                auVar180._12_4_ = auVar115._12_4_;
                auVar82 = rsqrtss(auVar180,auVar115);
                fVar121 = auVar82._0_4_;
                auVar181._4_12_ = auVar82._4_12_;
                auVar181._0_4_ = fVar121 * fVar121 * fVar184 * -0.5 * fVar121 + fVar121 * 1.5;
                fStack_4dc = fStack_4e4;
                if (fVar184 < 0.0) {
                  local_588._4_4_ = fVar204;
                  local_588._0_4_ = fVar186;
                  fStack_580 = fVar202 * fVar149;
                  fStack_57c = fVar204;
                  local_578 = fVar119;
                  fStack_574 = fVar165;
                  fStack_570 = fVar149 * fStack_530;
                  fStack_56c = fVar165;
                  local_568 = fVar163;
                  _local_508 = auVar181;
                  local_4f8 = fVar224;
                  fStack_4f4 = fVar232;
                  fStack_4f0 = fVar225;
                  fStack_4ec = fVar226;
                  fVar184 = sqrtf(fVar184);
                  auVar198._4_4_ = fStack_5a4;
                  auVar198._0_4_ = local_5a8;
                  auVar198._8_4_ = fStack_5a0;
                  auVar198._12_4_ = fStack_59c;
                  pRVar66 = extraout_RAX_06;
                  auVar181 = _local_508;
                  fVar119 = local_578;
                  fVar165 = fStack_574;
                  fVar163 = local_568;
                  fVar186 = (float)local_588._0_4_;
                  fVar204 = (float)local_588._4_4_;
                  fVar224 = local_4f8;
                }
                else {
                  fVar184 = SQRT(fVar184);
                }
                fVar184 = fVar184 - fStack_4ac;
                fVar119 = fVar119 * auVar181._0_4_ - fStack_5ac;
                auVar29._4_4_ = fStack_4e4;
                auVar29._0_4_ = local_4e8;
                auVar29._8_4_ = fStack_4e0;
                auVar29._12_4_ = fStack_4dc;
                auVar156._4_12_ = auVar29._4_12_;
                auVar156._0_4_ = local_4e8 * auVar181._0_4_;
                auVar249._0_8_ = CONCAT44(fVar165,fVar119) ^ 0x8000000080000000;
                auVar249._8_4_ = -fVar165;
                auVar249._12_4_ = fVar204;
                auVar248._8_8_ = auVar249._8_8_;
                auVar248._0_8_ = CONCAT44(fVar186,fVar119) ^ 0x80000000;
                auVar311._0_4_ = fVar186 * auVar156._0_4_ - (float)local_598._0_4_ * fVar119;
                auVar158._0_8_ = auVar156._0_8_;
                auVar158._8_4_ = fStack_4e4;
                auVar158._12_4_ = local_598._4_4_ ^ 0x80000000;
                auVar157._8_8_ = auVar158._8_8_;
                auVar157._0_8_ = CONCAT44(local_598._0_4_,auVar156._0_4_) ^ 0x8000000000000000;
                auVar311._4_4_ = auVar311._0_4_;
                auVar311._8_4_ = auVar311._0_4_;
                auVar311._12_4_ = auVar311._0_4_;
                auVar82 = divps(auVar157,auVar311);
                auVar151 = divps(auVar248,auVar311);
                fVar164 = fVar164 - (auVar82._4_4_ * fVar184 + auVar82._0_4_ * fVar224);
                fVar80 = fVar80 - (auVar151._4_4_ * fVar184 + auVar151._0_4_ * fVar224);
                if ((fVar163 <= ABS(fVar224)) ||
                   ((float)local_358._0_4_ * 1.9073486e-06 + local_548 + fVar163 <= ABS(fVar184))) {
                  bVar22 = false;
                }
                else {
                  fVar80 = fVar80 + (float)local_2d8._0_4_;
                  bVar22 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar80) &&
                       (fVar119 = (ray->super_RayK<1>).tfar, fVar80 <= fVar119)) && (0.0 <= fVar164)
                      ) && (fVar164 <= 1.0)) {
                    auVar82 = rsqrtss(auVar198,auVar198);
                    fVar121 = auVar82._0_4_;
                    pGVar18 = (context->scene->geometries).items[(long)local_550].ptr;
                    uVar75 = (ray->super_RayK<1>).mask;
                    pRVar66 = (RayHit *)(ulong)uVar75;
                    pRVar68 = local_550;
                    if ((pGVar18->mask & uVar75) != 0) {
                      fVar121 = fVar121 * 1.5 + fVar121 * fVar121 * local_338 * -0.5 * fVar121;
                      fVar184 = (float)local_538._0_4_ * fVar121;
                      fVar186 = (float)local_538._4_4_ * fVar121;
                      fVar121 = fStack_530 * fVar121;
                      fVar163 = fStack_5ac * fVar184 + (float)local_5b8._0_4_;
                      fVar149 = fStack_5ac * fVar186 + (float)local_5b8._4_4_;
                      fVar165 = fStack_5ac * fVar121 + fStack_5b0;
                      fVar185 = fVar186 * (float)local_5b8._0_4_ - (float)local_5b8._4_4_ * fVar184;
                      fVar186 = fVar121 * (float)local_5b8._4_4_ - fStack_5b0 * fVar186;
                      fVar184 = fVar184 * fStack_5b0 - (float)local_5b8._0_4_ * fVar121;
                      fVar121 = fVar149 * fVar186 - fVar184 * fVar163;
                      fVar149 = fVar165 * fVar184 - fVar185 * fVar149;
                      fVar163 = fVar163 * fVar185 - fVar186 * fVar165;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar80;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar163,fVar149);
                        (ray->Ng).field_0.field_0.z = fVar121;
                        ray->u = fVar164;
                        ray->v = 0.0;
                        ray->primID = (uint)local_4c0;
                        ray->geomID = (uint)local_550;
                        ray->instID[0] = context->user->instID[0];
                        uVar75 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar75;
                        pRVar66 = (RayHit *)(ulong)uVar75;
                      }
                      else {
                        local_428 = CONCAT44(fVar163,fVar149);
                        fStack_420 = fVar121;
                        fStack_41c = fVar164;
                        local_418 = 0;
                        local_414 = (uint)local_4c0;
                        local_410 = (uint)local_550;
                        local_40c = context->user->instID[0];
                        pRVar68 = (RTCIntersectArguments *)(ulong)local_40c;
                        local_408 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar80;
                        local_5bc = 0xffffffff;
                        local_498.geometryUserPtr = pGVar18->userPtr;
                        local_498.valid = &local_5bc;
                        local_498.context = context->user;
                        local_498.hit = (RTCHitN *)&local_428;
                        local_498.N = 1;
                        local_5a8 = fVar119;
                        local_498.ray = (RTCRayN *)ray;
                        if (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c1d3e6:
                          pRVar68 = context->args;
                          if (pRVar68->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar68->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar18->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar68->filter)(&local_498);
                            }
                            if ((((RayK<1> *)local_498.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00c1d497;
                          }
                          (((Vec3f *)((long)local_498.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_498.hit;
                          (((Vec3f *)((long)local_498.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_498.hit + 4);
                          (((Vec3f *)((long)local_498.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_498.hit + 8);
                          *(float *)((long)local_498.ray + 0x3c) = *(float *)(local_498.hit + 0xc);
                          *(float *)((long)local_498.ray + 0x40) = *(float *)(local_498.hit + 0x10);
                          *(float *)((long)local_498.ray + 0x44) = *(float *)(local_498.hit + 0x14);
                          *(float *)((long)local_498.ray + 0x48) = *(float *)(local_498.hit + 0x18);
                          *(float *)((long)local_498.ray + 0x4c) = *(float *)(local_498.hit + 0x1c);
                          pRVar68 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_498.hit + 0x20);
                          *(float *)((long)local_498.ray + 0x50) = *(float *)(local_498.hit + 0x20);
                          pRVar66 = (RayHit *)local_498.ray;
                        }
                        else {
                          (*pGVar18->intersectionFilterN)(&local_498);
                          if ((((RayK<1> *)local_498.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00c1d3e6;
LAB_00c1d497:
                          (ray->super_RayK<1>).tfar = local_5a8;
                          pRVar66 = (RayHit *)local_498.valid;
                        }
                      }
                    }
                  }
                }
                bVar74 = lVar73 == 0;
                lVar73 = lVar73 + -1;
                pRVar65 = (RayHit *)CONCAT71((int7)((ulong)pRVar66 >> 8),bVar74);
              } while ((!bVar22) && (!bVar74));
              fVar164 = (ray->super_RayK<1>).tfar;
              local_318._0_4_ = -(uint)(local_388 <= fVar164) & local_318._0_4_;
              local_318._4_4_ = -(uint)(fStack_384 <= fVar164) & local_318._4_4_;
              local_318._8_4_ = -(uint)(fStack_380 <= fVar164) & local_318._8_4_;
              local_318._12_4_ = -(uint)(fStack_37c <= fVar164) & local_318._12_4_;
              uVar67 = (undefined4)((ulong)pRVar66 >> 0x20);
              iVar61 = movmskps((int)pRVar65,local_318);
            } while (iVar61 != 0);
          }
          fVar164 = (ray->super_RayK<1>).tfar;
          auVar199._0_4_ =
               local_458._0_4_ & local_328._0_4_ &
               -(uint)(local_368 + (float)local_118._0_4_ <= fVar164);
          auVar199._4_4_ =
               local_458._4_4_ & local_328._4_4_ &
               -(uint)(fStack_364 + (float)local_118._4_4_ <= fVar164);
          auVar199._8_4_ =
               (uint)fStack_450 & (uint)fStack_320 & -(uint)(fStack_360 + fStack_110 <= fVar164);
          auVar199._12_4_ =
               (uint)fStack_44c & (uint)fStack_31c & -(uint)(fStack_35c + fStack_10c <= fVar164);
          auVar159._0_4_ =
               local_3d8._0_4_ & local_3e8._0_4_ &
               -(uint)(local_368 + (float)local_1a8._0_4_ <= fVar164);
          auVar159._4_4_ =
               local_3d8._4_4_ & local_3e8._4_4_ &
               -(uint)(fStack_364 + (float)local_1a8._4_4_ <= fVar164);
          auVar159._8_4_ =
               (uint)fStack_3d0 & (uint)fStack_3e0 & -(uint)(fStack_360 + fStack_1a0 <= fVar164);
          auVar159._12_4_ =
               (uint)fStack_3cc & (uint)fStack_3dc & -(uint)(fStack_35c + fStack_19c <= fVar164);
          iVar61 = movmskps(iVar61,auVar159 | auVar199);
          if (iVar61 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar69 * 0xc) = auVar159 | auVar199;
            auVar116._0_4_ = local_118._0_4_ & auVar199._0_4_;
            auVar116._4_4_ = local_118._4_4_ & auVar199._4_4_;
            auVar116._8_4_ = (uint)fStack_110 & auVar199._8_4_;
            auVar116._12_4_ = (uint)fStack_10c & auVar199._12_4_;
            auVar200._0_4_ = ~auVar199._0_4_ & local_1a8._0_4_;
            auVar200._4_4_ = ~auVar199._4_4_ & local_1a8._4_4_;
            auVar200._8_4_ = ~auVar199._8_4_ & (uint)fStack_1a0;
            auVar200._12_4_ = ~auVar199._12_4_ & (uint)fStack_19c;
            *(undefined1 (*) [16])(afStack_e8 + uVar69 * 0xc) = auVar200 | auVar116;
            afStack_d0[uVar69 * 0xc + -2] = local_3c8;
            afStack_d0[uVar69 * 0xc + -1] = fStack_3c4;
            fVar164 = (float)((int)local_460 + 1);
            pRVar68 = (RTCIntersectArguments *)(ulong)(uint)fVar164;
            afStack_d0[uVar69 * 0xc] = fVar164;
            uVar64 = (ulong)((int)uVar69 + 1);
          }
        }
      }
    }
    fVar119 = (ray->super_RayK<1>).tfar;
    fVar164 = local_3c8;
    fVar80 = fStack_3c4;
    uVar67 = uStack_3c0;
    uVar62 = uStack_3bc;
    do {
      uVar75 = (uint)uVar64;
      if (uVar75 == 0) {
        fVar164 = (ray->super_RayK<1>).tfar;
        auVar146._4_4_ = -(uint)(fStack_184 <= fVar164);
        auVar146._0_4_ = -(uint)(local_188 <= fVar164);
        auVar146._8_4_ = -(uint)(fStack_180 <= fVar164);
        auVar146._12_4_ = -(uint)(fStack_17c <= fVar164);
        uVar75 = movmskps((int)pRVar68,auVar146);
        uVar75 = (uint)local_2a0 - 1 & (uint)local_2a0 & uVar75;
        if (uVar75 == 0) {
          return;
        }
        goto LAB_00c1aab5;
      }
      uVar64 = (ulong)(uVar75 - 1);
      local_498.valid._0_4_ =
           -(uint)(local_368 + afStack_e8[uVar64 * 0xc] <= fVar119) & auStack_f8[uVar64 * 0xc];
      local_498.valid._4_4_ =
           -(uint)(fStack_364 + afStack_e8[uVar64 * 0xc + 1] <= fVar119) &
           auStack_f8[uVar64 * 0xc + 1];
      local_498.geometryUserPtr._0_4_ =
           -(uint)(fStack_360 + afStack_e8[uVar64 * 0xc + 2] <= fVar119) &
           auStack_f8[uVar64 * 0xc + 2];
      local_498.geometryUserPtr._4_4_ =
           -(uint)(fStack_35c + afStack_e8[uVar64 * 0xc + 3] <= fVar119) &
           (uint)afStack_e8[uVar64 * 0xc + -1];
      uVar76 = movmskps((int)pRVar68,(undefined1  [16])local_498._0_16_);
      pRVar68 = (RTCIntersectArguments *)(ulong)uVar76;
      if (uVar76 != 0) {
        auVar160._0_4_ = (uint)afStack_e8[uVar64 * 0xc] & (uint)local_498.valid;
        auVar160._4_4_ = (uint)afStack_e8[uVar64 * 0xc + 1] & local_498.valid._4_4_;
        auVar160._8_4_ = (uint)afStack_e8[uVar64 * 0xc + 2] & (uint)local_498.geometryUserPtr;
        auVar160._12_4_ = (uint)afStack_e8[uVar64 * 0xc + 3] & local_498.geometryUserPtr._4_4_;
        auVar182._0_8_ =
             CONCAT44(~local_498.valid._4_4_,~(uint)local_498.valid) & 0x7f8000007f800000;
        auVar182._8_4_ = ~(uint)local_498.geometryUserPtr & 0x7f800000;
        auVar182._12_4_ = ~local_498.geometryUserPtr._4_4_ & 0x7f800000;
        auVar182 = auVar182 | auVar160;
        auVar201._4_4_ = auVar182._0_4_;
        auVar201._0_4_ = auVar182._4_4_;
        auVar201._8_4_ = auVar182._12_4_;
        auVar201._12_4_ = auVar182._8_4_;
        auVar82 = minps(auVar201,auVar182);
        auVar161._0_8_ = auVar82._8_8_;
        auVar161._8_4_ = auVar82._0_4_;
        auVar161._12_4_ = auVar82._4_4_;
        auVar82 = minps(auVar161,auVar82);
        auVar162._0_8_ =
             CONCAT44(-(uint)(auVar82._4_4_ == auVar182._4_4_) & local_498.valid._4_4_,
                      -(uint)(auVar82._0_4_ == auVar182._0_4_) & (uint)local_498.valid);
        auVar162._8_4_ = -(uint)(auVar82._8_4_ == auVar182._8_4_) & (uint)local_498.geometryUserPtr;
        auVar162._12_4_ =
             -(uint)(auVar82._12_4_ == auVar182._12_4_) & local_498.geometryUserPtr._4_4_;
        iVar61 = movmskps((int)lVar70,auVar162);
        auVar145 = (undefined1  [16])local_498._0_16_;
        if (iVar61 != 0) {
          auVar145._8_4_ = auVar162._8_4_;
          auVar145._0_8_ = auVar162._0_8_;
          auVar145._12_4_ = auVar162._12_4_;
        }
        fVar164 = afStack_d0[uVar64 * 0xc + -2];
        fVar80 = afStack_d0[uVar64 * 0xc + -1];
        local_460 = (ulong)(uint)afStack_d0[uVar64 * 0xc];
        uVar77 = movmskps(afStack_d0[uVar64 * 0xc],auVar145);
        lVar70 = 0;
        if (uVar77 != 0) {
          for (; (uVar77 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
          }
        }
        *(undefined4 *)((long)&local_498.valid + lVar70 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar64 * 0xc) = (undefined1  [16])local_498._0_16_;
        iVar61 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar64 * 0xc),
                          (undefined1  [16])local_498._0_16_);
        if (iVar61 == 0) {
          uVar75 = uVar75 - 1;
        }
        fVar80 = fVar80 - fVar164;
        local_428 = CONCAT44(fVar80 * 0.33333334 + fVar164,fVar80 * 0.0 + fVar164);
        fStack_420 = fVar80 * 0.6666667 + fVar164;
        fStack_41c = fVar80 * 1.0 + fVar164;
        fVar164 = *(float *)((long)&local_428 + lVar70 * 4);
        fVar80 = *(float *)((long)&local_428 + lVar70 * 4 + 4);
        uVar67 = 0;
        uVar62 = 0;
        uVar64 = (ulong)uVar75;
      }
      uVar69 = uVar64;
    } while ((char)uVar76 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }